

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar17;
  ushort uVar18;
  ushort uVar19;
  RayQueryContext *pRVar20;
  Geometry *pGVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  RTCIntersectArguments *pRVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  byte bVar42;
  undefined1 (*pauVar43) [16];
  RayHit *pRVar44;
  int iVar45;
  undefined4 uVar46;
  long lVar47;
  undefined8 uVar48;
  RayHit *pRVar50;
  AABBNodeMB4D *node1;
  ulong uVar51;
  long lVar52;
  uint uVar53;
  long lVar54;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  ulong uVar55;
  RTCRayQueryContext *pRVar56;
  ulong uVar57;
  long lVar58;
  RayQueryContext *pRVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  RayQueryContext *pRVar65;
  long lVar66;
  byte bVar67;
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  byte bVar95;
  byte bVar96;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar97;
  float fVar98;
  uint uVar118;
  uint uVar119;
  vint4 ai;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  uint uVar123;
  uint uVar135;
  uint uVar136;
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar137;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  uint uVar138;
  uint uVar149;
  uint uVar150;
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  uint uVar151;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  vint4 ai_5;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar162;
  float fVar163;
  vint4 ai_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar164;
  uint uVar165;
  uint uVar169;
  uint uVar170;
  vint4 bi_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  uint uVar171;
  undefined1 auVar168 [16];
  float fVar172;
  float fVar174;
  float fVar181;
  float fVar184;
  vint4 ai_7;
  float fVar173;
  float fVar187;
  undefined1 auVar175 [16];
  float fVar182;
  float fVar185;
  float fVar188;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar183;
  float fVar186;
  float fVar189;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  undefined1 auVar194 [16];
  float fVar204;
  float fVar208;
  float fVar211;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar217;
  float fVar222;
  float fVar224;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar221 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar241;
  float fVar243;
  undefined1 auVar239 [16];
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar240 [16];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  vint4 bi_2;
  vfloat<4> dist;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_14a1;
  ulong local_14a0;
  undefined1 local_1498 [8];
  float fStack_1490;
  float fStack_148c;
  undefined1 local_1488 [8];
  float fStack_1480;
  float fStack_147c;
  undefined1 local_1474 [32];
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined4 local_1448;
  anon_union_12_2_4062524c_for_Vec3<float>_1 aStack_1444;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  uint local_1428 [1];
  uint auStack_1424 [1];
  float fStack_1420;
  float fStack_141c;
  undefined1 local_1418 [16];
  RayQueryContext *local_1400;
  RTCFilterFunctionNArguments local_13f8;
  undefined8 local_13c8;
  float fStack_13c0;
  float fStack_13bc;
  undefined8 local_13b8;
  float fStack_13b0;
  float fStack_13ac;
  float local_13a8;
  float fStack_13a4;
  float fStack_13a0;
  float fStack_139c;
  float local_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  undefined8 local_1388;
  float fStack_1380;
  float fStack_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  undefined4 local_1364;
  undefined4 local_1360;
  undefined4 local_135c;
  undefined4 local_1358;
  undefined4 local_1354;
  undefined4 local_1350;
  uint local_134c;
  uint local_1348;
  long local_1330;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  undefined1 local_1308 [8];
  float fStack_1300;
  float fStack_12fc;
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float local_12c8;
  float fStack_12c4;
  float fStack_12c0;
  float fStack_12bc;
  undefined1 local_12b8 [8];
  float fStack_12b0;
  float fStack_12ac;
  float local_12a8;
  float fStack_12a4;
  float fStack_12a0;
  float fStack_129c;
  undefined1 local_1298 [16];
  undefined1 *local_1288;
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  undefined1 local_1248 [16];
  undefined1 local_1238 [16];
  undefined1 local_1228 [16];
  undefined1 local_1218 [16];
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  undefined1 (*local_11f0) [16];
  long local_11e8;
  long local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  RayHit *local_11b0;
  Scene *local_11a8;
  ulong local_11a0;
  undefined1 local_1198 [16];
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  uint local_1148;
  uint uStack_1144;
  uint uStack_1140;
  uint uStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [8];
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined8 local_1098;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  undefined1 local_f98 [16];
  float local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  ulong uVar49;
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_11f0 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar98 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar188 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar211 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar97 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar17 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar209 = 0.0;
    if (0.0 <= fVar97) {
      fVar209 = fVar97;
    }
    fVar97 = (ray->super_RayK<1>).tfar;
    fVar164 = 0.0;
    if (0.0 <= fVar97) {
      fVar164 = fVar97;
    }
    auVar124._4_4_ = -(uint)(ABS(aVar17.y) < 1e-18);
    auVar124._0_4_ = -(uint)(ABS(aVar17.x) < 1e-18);
    auVar124._8_4_ = -(uint)(ABS(aVar17.z) < 1e-18);
    auVar124._12_4_ = -(uint)(ABS(aVar17.field_3.w) < 1e-18);
    auVar218 = divps(_DAT_01f7ba10,(undefined1  [16])aVar17);
    auVar218 = blendvps(auVar218,_DAT_01fab950,auVar124);
    fVar229 = auVar218._0_4_ * 0.99999964;
    fVar231 = auVar218._4_4_ * 0.99999964;
    fVar233 = auVar218._8_4_ * 0.99999964;
    fVar217 = auVar218._0_4_ * 1.0000004;
    fVar222 = auVar218._4_4_ * 1.0000004;
    fVar224 = auVar218._8_4_ * 1.0000004;
    local_10d8._4_4_ = fVar222;
    local_10d8._0_4_ = fVar222;
    fStack_10d0 = fVar222;
    fStack_10cc = fVar222;
    uVar60 = (ulong)(fVar229 < 0.0) << 4;
    uVar61 = (ulong)(fVar231 < 0.0) << 4 | 0x20;
    uVar55 = (ulong)(fVar233 < 0.0) << 4 | 0x40;
    uVar62 = uVar60 ^ 0x10;
    uVar64 = uVar61 ^ 0x10;
    uVar57 = uVar55 ^ 0x10;
    auVar218._4_4_ = fVar209;
    auVar218._0_4_ = fVar209;
    auVar218._8_4_ = fVar209;
    auVar218._12_4_ = fVar209;
    auVar109._4_4_ = fVar164;
    auVar109._0_4_ = fVar164;
    auVar109._8_4_ = fVar164;
    auVar109._12_4_ = fVar164;
    _local_1148 = mm_lookupmask_ps._240_8_;
    _uStack_1140 = mm_lookupmask_ps._248_8_;
    local_1208 = fVar217;
    fStack_1204 = fVar217;
    fStack_1200 = fVar217;
    fStack_11fc = fVar217;
    local_1400 = context;
    local_11b0 = ray;
    local_1188 = fVar211;
    fStack_1184 = fVar211;
    fStack_1180 = fVar211;
    fStack_117c = fVar211;
    local_1198 = auVar218;
    local_10a8 = fVar224;
    fStack_10a4 = fVar224;
    fStack_10a0 = fVar224;
    fStack_109c = fVar224;
    local_10b8 = fVar233;
    fStack_10b4 = fVar233;
    fStack_10b0 = fVar233;
    fStack_10ac = fVar233;
    local_10c8 = fVar98;
    fStack_10c4 = fVar98;
    fStack_10c0 = fVar98;
    fStack_10bc = fVar98;
    local_1158 = fVar188;
    fStack_1154 = fVar188;
    fStack_1150 = fVar188;
    fStack_114c = fVar188;
    local_11b8 = uVar60;
    local_1168 = fVar229;
    fStack_1164 = fVar229;
    fStack_1160 = fVar229;
    fStack_115c = fVar229;
    local_1178 = fVar231;
    fStack_1174 = fVar231;
    fStack_1170 = fVar231;
    fStack_116c = fVar231;
    local_11c0 = uVar61;
    local_11c8 = uVar55;
    local_11d0 = uVar62;
    local_11d8 = uVar64;
    local_1474._12_8_ = uVar57;
    fVar209 = fVar217;
    fVar164 = fVar217;
    fVar222 = fVar217;
    fVar243 = fVar98;
    fVar241 = fVar98;
    fVar237 = fVar98;
    fVar236 = fVar224;
    fVar235 = fVar224;
    fVar234 = fVar224;
    fVar187 = fVar211;
    fVar163 = fVar211;
    fVar162 = fVar211;
    fVar184 = fVar231;
    fVar181 = fVar231;
    fVar172 = fVar231;
    fVar205 = fVar229;
    fVar201 = fVar229;
    fVar190 = fVar229;
    fVar186 = fVar233;
    fVar183 = fVar233;
    fVar174 = fVar233;
    fVar122 = fVar188;
    fVar121 = fVar188;
    fVar189 = fVar188;
    pRVar65 = context;
LAB_00db03ce:
    do {
      pauVar43 = local_11f0 + -1;
      local_11f0 = local_11f0 + -1;
      if (*(float *)((long)*pauVar43 + 8) <= fVar97) {
        pRVar59 = *(RayQueryContext **)*local_11f0;
        while (((ulong)pRVar59 & 8) == 0) {
          fVar173 = (ray->super_RayK<1>).dir.field_0.m128[3];
          fVar97 = (ray->super_RayK<1>).tfar;
          uVar51 = (ulong)pRVar59 & 0xfffffffffffffff0;
          pfVar15 = (float *)(uVar51 + 0x80 + uVar60);
          pfVar14 = (float *)(uVar51 + 0x20 + uVar60);
          auVar160._0_4_ = ((*pfVar15 * fVar173 + *pfVar14) - fVar237) * fVar190;
          auVar160._4_4_ = ((pfVar15[1] * fVar173 + pfVar14[1]) - fVar241) * fVar201;
          auVar160._8_4_ = ((pfVar15[2] * fVar173 + pfVar14[2]) - fVar243) * fVar205;
          auVar160._12_4_ = ((pfVar15[3] * fVar173 + pfVar14[3]) - fVar98) * fVar229;
          pfVar15 = (float *)(uVar51 + 0x80 + uVar61);
          pfVar14 = (float *)(uVar51 + 0x20 + uVar61);
          auVar178._0_4_ = ((*pfVar15 * fVar173 + *pfVar14) - fVar189) * fVar172;
          auVar178._4_4_ = ((pfVar15[1] * fVar173 + pfVar14[1]) - fVar121) * fVar181;
          auVar178._8_4_ = ((pfVar15[2] * fVar173 + pfVar14[2]) - fVar122) * fVar184;
          auVar178._12_4_ = ((pfVar15[3] * fVar173 + pfVar14[3]) - fVar188) * fVar231;
          pfVar15 = (float *)(uVar51 + 0x80 + uVar55);
          pfVar14 = (float *)(uVar51 + 0x20 + uVar55);
          auVar152._0_4_ = ((*pfVar15 * fVar173 + *pfVar14) - fVar162) * fVar174;
          auVar152._4_4_ = ((pfVar15[1] * fVar173 + pfVar14[1]) - fVar163) * fVar183;
          auVar152._8_4_ = ((pfVar15[2] * fVar173 + pfVar14[2]) - fVar187) * fVar186;
          auVar152._12_4_ = ((pfVar15[3] * fVar173 + pfVar14[3]) - fVar211) * fVar233;
          auVar152 = maxps(auVar178,auVar152);
          auVar124 = maxps(auVar218,auVar160);
          _local_12b8 = maxps(auVar124,auVar152);
          pfVar15 = (float *)(uVar51 + 0x80 + uVar62);
          pfVar14 = (float *)(uVar51 + 0x20 + uVar62);
          auVar153._0_4_ = ((*pfVar15 * fVar173 + *pfVar14) - fVar237) * fVar217;
          auVar153._4_4_ = ((pfVar15[1] * fVar173 + pfVar14[1]) - fVar241) * fVar209;
          auVar153._8_4_ = ((pfVar15[2] * fVar173 + pfVar14[2]) - fVar243) * fVar164;
          auVar153._12_4_ = ((pfVar15[3] * fVar173 + pfVar14[3]) - fVar98) * fVar222;
          pfVar15 = (float *)(uVar51 + 0x80 + uVar64);
          pfVar14 = (float *)(uVar51 + 0x20 + uVar64);
          auVar156._0_4_ = ((*pfVar15 * fVar173 + *pfVar14) - fVar189) * (float)local_10d8._0_4_;
          auVar156._4_4_ = ((pfVar15[1] * fVar173 + pfVar14[1]) - fVar121) * (float)local_10d8._4_4_
          ;
          auVar156._8_4_ = ((pfVar15[2] * fVar173 + pfVar14[2]) - fVar122) * fStack_10d0;
          auVar156._12_4_ = ((pfVar15[3] * fVar173 + pfVar14[3]) - fVar188) * fStack_10cc;
          pfVar15 = (float *)(uVar51 + 0x80 + uVar57);
          pfVar14 = (float *)(uVar51 + 0x20 + uVar57);
          auVar167._0_4_ = ((*pfVar15 * fVar173 + *pfVar14) - fVar162) * fVar234;
          auVar167._4_4_ = ((pfVar15[1] * fVar173 + pfVar14[1]) - fVar163) * fVar235;
          auVar167._8_4_ = ((pfVar15[2] * fVar173 + pfVar14[2]) - fVar187) * fVar236;
          auVar167._12_4_ = ((pfVar15[3] * fVar173 + pfVar14[3]) - fVar211) * fVar224;
          auVar152 = minps(auVar156,auVar167);
          auVar124 = minps(auVar109,auVar153);
          auVar124 = minps(auVar124,auVar152);
          if (((uint)pRVar59 & 7) == 6) {
            bVar27 = (fVar173 < *(float *)(uVar51 + 0xf0) && *(float *)(uVar51 + 0xe0) <= fVar173)
                     && local_12b8._0_4_ <= auVar124._0_4_;
            bVar28 = (fVar173 < *(float *)(uVar51 + 0xf4) && *(float *)(uVar51 + 0xe4) <= fVar173)
                     && local_12b8._4_4_ <= auVar124._4_4_;
            bVar29 = (fVar173 < *(float *)(uVar51 + 0xf8) && *(float *)(uVar51 + 0xe8) <= fVar173)
                     && local_12b8._8_4_ <= auVar124._8_4_;
            bVar30 = (fVar173 < *(float *)(uVar51 + 0xfc) && *(float *)(uVar51 + 0xec) <= fVar173)
                     && local_12b8._12_4_ <= auVar124._12_4_;
          }
          else {
            bVar27 = local_12b8._0_4_ <= auVar124._0_4_;
            bVar28 = local_12b8._4_4_ <= auVar124._4_4_;
            bVar29 = local_12b8._8_4_ <= auVar124._8_4_;
            bVar30 = local_12b8._12_4_ <= auVar124._12_4_;
          }
          auVar99._0_4_ = (uint)bVar27 * -0x80000000;
          auVar99._4_4_ = (uint)bVar28 * -0x80000000;
          auVar99._8_4_ = (uint)bVar29 * -0x80000000;
          auVar99._12_4_ = (uint)bVar30 * -0x80000000;
          uVar53 = movmskps((int)context,auVar99);
          context = (RayQueryContext *)(ulong)uVar53;
          if (uVar53 == 0) {
            if (local_11f0 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00db03ce;
          }
          context = (RayQueryContext *)0x0;
          if ((byte)uVar53 != 0) {
            for (; ((byte)uVar53 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          pRVar20 = *(RayQueryContext **)(uVar51 + (long)context * 8);
          uVar53 = (uVar53 & 0xff) - 1 & uVar53 & 0xff;
          pRVar59 = pRVar20;
          if (uVar53 != 0) {
            uVar118 = *(uint *)(local_12b8 + (long)context * 4);
            lVar58 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
              }
            }
            pRVar59 = *(RayQueryContext **)(uVar51 + lVar58 * 8);
            uVar119 = *(uint *)(local_12b8 + lVar58 * 4);
            uVar53 = uVar53 - 1 & uVar53;
            context = (RayQueryContext *)(ulong)uVar53;
            if (uVar53 == 0) {
              if (uVar118 < uVar119) {
                *(RayQueryContext **)*local_11f0 = pRVar59;
                *(uint *)((long)*local_11f0 + 8) = uVar119;
                local_11f0 = local_11f0 + 1;
                pRVar59 = pRVar20;
              }
              else {
                *(RayQueryContext **)*local_11f0 = pRVar20;
                *(uint *)((long)*local_11f0 + 8) = uVar118;
                local_11f0 = local_11f0 + 1;
                context = pRVar20;
              }
            }
            else {
              auVar100._8_4_ = uVar118;
              auVar100._0_8_ = pRVar20;
              auVar100._12_4_ = 0;
              auVar139._8_4_ = uVar119;
              auVar139._0_8_ = pRVar59;
              auVar139._12_4_ = 0;
              lVar58 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar53 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                }
              }
              uVar48 = *(undefined8 *)(uVar51 + lVar58 * 8);
              iVar45 = *(int *)(local_12b8 + lVar58 * 4);
              auVar125._8_4_ = iVar45;
              auVar125._0_8_ = uVar48;
              auVar125._12_4_ = 0;
              auVar68._8_4_ = -(uint)((int)uVar118 < (int)uVar119);
              uVar53 = uVar53 - 1 & uVar53;
              if (uVar53 == 0) {
                auVar68._4_4_ = auVar68._8_4_;
                auVar68._0_4_ = auVar68._8_4_;
                auVar68._12_4_ = auVar68._8_4_;
                auVar154._8_4_ = uVar119;
                auVar154._0_8_ = pRVar59;
                auVar154._12_4_ = 0;
                auVar152 = blendvps(auVar154,auVar100,auVar68);
                auVar124 = blendvps(auVar100,auVar139,auVar68);
                auVar69._8_4_ = -(uint)(auVar152._8_4_ < iVar45);
                auVar69._4_4_ = auVar69._8_4_;
                auVar69._0_4_ = auVar69._8_4_;
                auVar69._12_4_ = auVar69._8_4_;
                auVar140._8_4_ = iVar45;
                auVar140._0_8_ = uVar48;
                auVar140._12_4_ = 0;
                auVar160 = blendvps(auVar140,auVar152,auVar69);
                auVar167 = blendvps(auVar152,auVar125,auVar69);
                auVar70._8_4_ = -(uint)(auVar124._8_4_ < auVar167._8_4_);
                auVar70._4_4_ = auVar70._8_4_;
                auVar70._0_4_ = auVar70._8_4_;
                auVar70._12_4_ = auVar70._8_4_;
                auVar152 = blendvps(auVar167,auVar124,auVar70);
                auVar124 = blendvps(auVar124,auVar167,auVar70);
                *local_11f0 = auVar124;
                local_11f0[1] = auVar152;
                pRVar59 = auVar160._0_8_;
                local_11f0 = local_11f0 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar53 != 0) {
                  for (; (uVar53 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar71._4_4_ = auVar68._8_4_;
                auVar71._0_4_ = auVar68._8_4_;
                auVar71._8_4_ = auVar68._8_4_;
                auVar71._12_4_ = auVar68._8_4_;
                auVar167 = blendvps(auVar139,auVar100,auVar71);
                auVar124 = blendvps(auVar100,auVar139,auVar71);
                auVar157._8_4_ = *(int *)(local_12b8 + (long)context * 4);
                auVar157._0_8_ = *(undefined8 *)(uVar51 + (long)context * 8);
                auVar157._12_4_ = 0;
                auVar72._8_4_ = -(uint)(iVar45 < *(int *)(local_12b8 + (long)context * 4));
                auVar72._4_4_ = auVar72._8_4_;
                auVar72._0_4_ = auVar72._8_4_;
                auVar72._12_4_ = auVar72._8_4_;
                auVar160 = blendvps(auVar157,auVar125,auVar72);
                auVar152 = blendvps(auVar125,auVar157,auVar72);
                auVar73._8_4_ = -(uint)(auVar124._8_4_ < auVar152._8_4_);
                auVar73._4_4_ = auVar73._8_4_;
                auVar73._0_4_ = auVar73._8_4_;
                auVar73._12_4_ = auVar73._8_4_;
                auVar178 = blendvps(auVar152,auVar124,auVar73);
                auVar124 = blendvps(auVar124,auVar152,auVar73);
                auVar74._8_4_ = -(uint)(auVar167._8_4_ < auVar160._8_4_);
                auVar74._4_4_ = auVar74._8_4_;
                auVar74._0_4_ = auVar74._8_4_;
                auVar74._12_4_ = auVar74._8_4_;
                auVar152 = blendvps(auVar160,auVar167,auVar74);
                auVar167 = blendvps(auVar167,auVar160,auVar74);
                auVar75._8_4_ = -(uint)(auVar167._8_4_ < auVar178._8_4_);
                auVar75._4_4_ = auVar75._8_4_;
                auVar75._0_4_ = auVar75._8_4_;
                auVar75._12_4_ = auVar75._8_4_;
                auVar160 = blendvps(auVar178,auVar167,auVar75);
                auVar167 = blendvps(auVar167,auVar178,auVar75);
                *local_11f0 = auVar124;
                local_11f0[1] = auVar167;
                local_11f0[2] = auVar160;
                pRVar59 = auVar152._0_8_;
                local_11f0 = local_11f0 + 3;
                fVar217 = local_1208;
                fVar209 = fStack_1204;
                fVar164 = fStack_1200;
                fVar222 = fStack_11fc;
              }
            }
          }
        }
        local_11e8 = (ulong)((uint)pRVar59 & 0xf) - 8;
        if (local_11e8 != 0) {
          uVar51 = (ulong)pRVar59 & 0xfffffffffffffff0;
          local_11e0 = 0;
          local_1048 = auVar109;
          local_14a0 = uVar51;
          do {
            local_1330 = local_11e0 * 0x90;
            fVar229 = ((ray->super_RayK<1>).dir.field_0.m128[3] -
                      *(float *)(uVar51 + 0x80 + local_1330)) *
                      *(float *)(uVar51 + 0x84 + local_1330);
            uVar49 = *(ulong *)(uVar51 + 0x20 + local_1330);
            auVar101._8_8_ = 0;
            auVar101._0_8_ = uVar49;
            uVar16 = *(ulong *)(uVar51 + 0x24 + local_1330);
            auVar141._8_8_ = 0;
            auVar141._0_8_ = uVar16;
            bVar31 = (byte)uVar16;
            bVar67 = (byte)uVar49;
            bVar32 = (byte)(uVar16 >> 8);
            bVar91 = (byte)(uVar49 >> 8);
            bVar33 = (byte)(uVar16 >> 0x10);
            bVar92 = (byte)(uVar49 >> 0x10);
            bVar34 = (byte)(uVar16 >> 0x18);
            bVar93 = (byte)(uVar49 >> 0x18);
            bVar35 = (byte)(uVar16 >> 0x20);
            bVar94 = (byte)(uVar49 >> 0x20);
            bVar36 = (byte)(uVar16 >> 0x28);
            bVar95 = (byte)(uVar49 >> 0x28);
            bVar37 = (byte)(uVar16 >> 0x30);
            bVar96 = (byte)(uVar49 >> 0x30);
            bVar42 = (byte)(uVar49 >> 0x38);
            bVar38 = (byte)(uVar16 >> 0x38);
            auVar76[0] = -((byte)((bVar31 < bVar67) * bVar31 | (bVar31 >= bVar67) * bVar67) ==
                          bVar67);
            auVar76[1] = -((byte)((bVar32 < bVar91) * bVar32 | (bVar32 >= bVar91) * bVar91) ==
                          bVar91);
            auVar76[2] = -((byte)((bVar33 < bVar92) * bVar33 | (bVar33 >= bVar92) * bVar92) ==
                          bVar92);
            auVar76[3] = -((byte)((bVar34 < bVar93) * bVar34 | (bVar34 >= bVar93) * bVar93) ==
                          bVar93);
            auVar76[4] = -((byte)((bVar35 < bVar94) * bVar35 | (bVar35 >= bVar94) * bVar94) ==
                          bVar94);
            auVar76[5] = -((byte)((bVar36 < bVar95) * bVar36 | (bVar36 >= bVar95) * bVar95) ==
                          bVar95);
            auVar76[6] = -((byte)((bVar37 < bVar96) * bVar37 | (bVar37 >= bVar96) * bVar96) ==
                          bVar96);
            auVar76[7] = -((byte)((bVar38 < bVar42) * bVar38 | (bVar38 >= bVar42) * bVar42) ==
                          bVar42);
            auVar76[8] = 0xff;
            auVar76[9] = 0xff;
            auVar76[10] = 0xff;
            auVar76[0xb] = 0xff;
            auVar76[0xc] = 0xff;
            auVar76[0xd] = 0xff;
            auVar76[0xe] = 0xff;
            auVar76[0xf] = 0xff;
            auVar218 = pmovzxbd(auVar101,auVar101);
            fVar209 = *(float *)(uVar51 + 0x38 + local_1330);
            fVar188 = *(float *)(uVar51 + 0x3c + local_1330);
            fVar211 = *(float *)(uVar51 + 0x40 + local_1330);
            fVar97 = *(float *)(uVar51 + 0x44 + local_1330);
            fVar190 = (float)auVar218._0_4_ * fVar97 + fVar209;
            fVar201 = (float)auVar218._4_4_ * fVar97 + fVar209;
            fVar205 = (float)auVar218._8_4_ * fVar97 + fVar209;
            fVar231 = (float)auVar218._12_4_ * fVar97 + fVar209;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = *(ulong *)(uVar51 + 0x50 + local_1330);
            auVar218 = pmovzxbd(auVar102,auVar102);
            fVar164 = *(float *)(uVar51 + 0x74 + local_1330);
            fVar217 = *(float *)(uVar51 + 0x68 + local_1330);
            auVar124 = pmovzxbd(auVar141,auVar141);
            fVar191 = (float)auVar124._0_4_ * fVar97 + fVar209;
            fVar202 = (float)auVar124._4_4_ * fVar97 + fVar209;
            fVar206 = (float)auVar124._8_4_ * fVar97 + fVar209;
            fVar209 = (float)auVar124._12_4_ * fVar97 + fVar209;
            auVar142._8_8_ = 0;
            auVar142._0_8_ = *(ulong *)(uVar51 + 0x54 + local_1330);
            auVar124 = pmovzxbd(auVar142,auVar142);
            auVar158._8_8_ = 0;
            auVar158._0_8_ = *(ulong *)(uVar51 + 0x28 + local_1330);
            auVar152 = pmovzxbd(auVar158,auVar158);
            fVar97 = *(float *)(uVar51 + 0x48 + local_1330);
            fVar172 = (float)auVar152._0_4_ * fVar97 + fVar188;
            fVar181 = (float)auVar152._4_4_ * fVar97 + fVar188;
            fVar184 = (float)auVar152._8_4_ * fVar97 + fVar188;
            fVar187 = (float)auVar152._12_4_ * fVar97 + fVar188;
            auVar159._8_8_ = 0;
            auVar159._0_8_ = *(ulong *)(uVar51 + 0x58 + local_1330);
            auVar160 = pmovzxbd(auVar159,auVar159);
            fVar222 = *(float *)(uVar51 + 0x78 + local_1330);
            fVar189 = *(float *)(uVar51 + 0x6c + local_1330);
            auVar175._8_8_ = 0;
            auVar175._0_8_ = *(ulong *)(uVar51 + 0x2c + local_1330);
            auVar152 = pmovzxbd(auVar175,auVar175);
            fVar173 = (float)auVar152._0_4_ * fVar97 + fVar188;
            fVar182 = (float)auVar152._4_4_ * fVar97 + fVar188;
            fVar185 = (float)auVar152._8_4_ * fVar97 + fVar188;
            fVar188 = (float)auVar152._12_4_ * fVar97 + fVar188;
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(uVar51 + 0x5c + local_1330);
            auVar167 = pmovzxbd(auVar166,auVar166);
            auVar176._8_8_ = 0;
            auVar176._0_8_ = *(ulong *)(uVar51 + 0x30 + local_1330);
            auVar152 = pmovzxbd(auVar176,auVar176);
            fVar97 = *(float *)(uVar51 + 0x4c + local_1330);
            fVar192 = (float)auVar152._0_4_ * fVar97 + fVar211;
            fVar203 = (float)auVar152._4_4_ * fVar97 + fVar211;
            fVar207 = (float)auVar152._8_4_ * fVar97 + fVar211;
            fVar210 = (float)auVar152._12_4_ * fVar97 + fVar211;
            auVar177._8_8_ = 0;
            auVar177._0_8_ = *(ulong *)(uVar51 + 0x60 + local_1330);
            auVar178 = pmovzxbd(auVar177,auVar177);
            fVar121 = *(float *)(uVar51 + 0x7c + local_1330);
            fVar122 = *(float *)(uVar51 + 0x70 + local_1330);
            auVar194._8_8_ = 0;
            auVar194._0_8_ = *(ulong *)(uVar51 + 0x34 + local_1330);
            auVar152 = pmovzxbd(auVar194,auVar194);
            fVar193 = (float)auVar152._0_4_ * fVar97 + fVar211;
            fVar204 = (float)auVar152._4_4_ * fVar97 + fVar211;
            fVar208 = (float)auVar152._8_4_ * fVar97 + fVar211;
            fVar211 = (float)auVar152._12_4_ * fVar97 + fVar211;
            auVar155._8_8_ = 0;
            auVar155._0_8_ = *(ulong *)(uVar51 + 100 + local_1330);
            auVar152 = pmovzxbd(auVar155,auVar155);
            fVar97 = (((((float)auVar218._0_4_ * fVar164 + fVar217) - fVar190) * fVar229 + fVar190)
                     - fVar237) * local_1168;
            fVar190 = (((((float)auVar218._4_4_ * fVar164 + fVar217) - fVar201) * fVar229 + fVar201)
                      - fVar241) * fStack_1164;
            fVar201 = (((((float)auVar218._8_4_ * fVar164 + fVar217) - fVar205) * fVar229 + fVar205)
                      - fVar243) * fStack_1160;
            fVar205 = (((((float)auVar218._12_4_ * fVar164 + fVar217) - fVar231) * fVar229 + fVar231
                       ) - fVar98) * fStack_115c;
            fVar231 = (((((float)auVar160._0_4_ * fVar222 + fVar189) - fVar172) * fVar229 + fVar172)
                      - local_1158) * local_1178;
            fVar162 = (((((float)auVar160._4_4_ * fVar222 + fVar189) - fVar181) * fVar229 + fVar181)
                      - fStack_1154) * fStack_1174;
            fVar163 = (((((float)auVar160._8_4_ * fVar222 + fVar189) - fVar184) * fVar229 + fVar184)
                      - fStack_1150) * fStack_1170;
            fVar187 = (((((float)auVar160._12_4_ * fVar222 + fVar189) - fVar187) * fVar229 + fVar187
                       ) - fStack_114c) * fStack_116c;
            fVar172 = (((((float)auVar124._0_4_ * fVar164 + fVar217) - fVar191) * fVar229 + fVar191)
                      - fVar237) * local_1208;
            fVar181 = (((((float)auVar124._4_4_ * fVar164 + fVar217) - fVar202) * fVar229 + fVar202)
                      - fVar241) * fStack_1204;
            fVar184 = (((((float)auVar124._8_4_ * fVar164 + fVar217) - fVar206) * fVar229 + fVar206)
                      - fVar243) * fStack_1200;
            fVar209 = (((((float)auVar124._12_4_ * fVar164 + fVar217) - fVar209) * fVar229 + fVar209
                       ) - fVar98) * fStack_11fc;
            fVar164 = (((((float)auVar167._0_4_ * fVar222 + fVar189) - fVar173) * fVar229 + fVar173)
                      - local_1158) * (float)local_10d8._0_4_;
            fVar217 = (((((float)auVar167._4_4_ * fVar222 + fVar189) - fVar182) * fVar229 + fVar182)
                      - fStack_1154) * (float)local_10d8._4_4_;
            fVar173 = (((((float)auVar167._8_4_ * fVar222 + fVar189) - fVar185) * fVar229 + fVar185)
                      - fStack_1150) * fStack_10d0;
            fVar188 = (((((float)auVar167._12_4_ * fVar222 + fVar189) - fVar188) * fVar229 + fVar188
                       ) - fStack_114c) * fStack_10cc;
            uVar123 = (uint)((int)fVar172 < (int)fVar97) * (int)fVar172 |
                      (uint)((int)fVar172 >= (int)fVar97) * (int)fVar97;
            uVar135 = (uint)((int)fVar181 < (int)fVar190) * (int)fVar181 |
                      (uint)((int)fVar181 >= (int)fVar190) * (int)fVar190;
            uVar136 = (uint)((int)fVar184 < (int)fVar201) * (int)fVar184 |
                      (uint)((int)fVar184 >= (int)fVar201) * (int)fVar201;
            uVar137 = (uint)((int)fVar209 < (int)fVar205) * (int)fVar209 |
                      (uint)((int)fVar209 >= (int)fVar205) * (int)fVar205;
            uVar138 = (uint)((int)fVar172 < (int)fVar97) * (int)fVar97 |
                      (uint)((int)fVar172 >= (int)fVar97) * (int)fVar172;
            uVar149 = (uint)((int)fVar181 < (int)fVar190) * (int)fVar190 |
                      (uint)((int)fVar181 >= (int)fVar190) * (int)fVar181;
            uVar150 = (uint)((int)fVar184 < (int)fVar201) * (int)fVar201 |
                      (uint)((int)fVar184 >= (int)fVar201) * (int)fVar184;
            uVar151 = (uint)((int)fVar209 < (int)fVar205) * (int)fVar205 |
                      (uint)((int)fVar209 >= (int)fVar205) * (int)fVar209;
            uVar53 = (uint)((int)fVar164 < (int)fVar231) * (int)fVar164 |
                     (uint)((int)fVar164 >= (int)fVar231) * (int)fVar231;
            uVar118 = (uint)((int)fVar217 < (int)fVar162) * (int)fVar217 |
                      (uint)((int)fVar217 >= (int)fVar162) * (int)fVar162;
            uVar119 = (uint)((int)fVar173 < (int)fVar163) * (int)fVar173 |
                      (uint)((int)fVar173 >= (int)fVar163) * (int)fVar163;
            uVar120 = (uint)((int)fVar188 < (int)fVar187) * (int)fVar188 |
                      (uint)((int)fVar188 >= (int)fVar187) * (int)fVar187;
            uVar53 = ((int)uVar53 < (int)uVar123) * uVar123 | ((int)uVar53 >= (int)uVar123) * uVar53
            ;
            uVar118 = ((int)uVar118 < (int)uVar135) * uVar135 |
                      ((int)uVar118 >= (int)uVar135) * uVar118;
            uVar119 = ((int)uVar119 < (int)uVar136) * uVar136 |
                      ((int)uVar119 >= (int)uVar136) * uVar119;
            uVar120 = ((int)uVar120 < (int)uVar137) * uVar137 |
                      ((int)uVar120 >= (int)uVar137) * uVar120;
            uVar123 = (uint)((int)fVar164 < (int)fVar231) * (int)fVar231 |
                      (uint)((int)fVar164 >= (int)fVar231) * (int)fVar164;
            uVar135 = (uint)((int)fVar217 < (int)fVar162) * (int)fVar162 |
                      (uint)((int)fVar217 >= (int)fVar162) * (int)fVar217;
            uVar136 = (uint)((int)fVar173 < (int)fVar163) * (int)fVar163 |
                      (uint)((int)fVar173 >= (int)fVar163) * (int)fVar173;
            uVar137 = (uint)((int)fVar188 < (int)fVar187) * (int)fVar187 |
                      (uint)((int)fVar188 >= (int)fVar187) * (int)fVar188;
            fVar164 = (((((float)auVar178._0_4_ * fVar121 + fVar122) - fVar192) * fVar229 + fVar192)
                      - local_1188) * fVar174;
            fVar217 = (((((float)auVar178._4_4_ * fVar121 + fVar122) - fVar203) * fVar229 + fVar203)
                      - fStack_1184) * fVar183;
            fVar222 = (((((float)auVar178._8_4_ * fVar121 + fVar122) - fVar207) * fVar229 + fVar207)
                      - fStack_1180) * fVar186;
            fVar189 = (((((float)auVar178._12_4_ * fVar121 + fVar122) - fVar210) * fVar229 + fVar210
                       ) - fStack_117c) * fVar233;
            fVar209 = (((((float)auVar152._0_4_ * fVar121 + fVar122) - fVar193) * fVar229 + fVar193)
                      - local_1188) * fVar234;
            fVar188 = (((((float)auVar152._4_4_ * fVar121 + fVar122) - fVar204) * fVar229 + fVar204)
                      - fStack_1184) * fVar235;
            fVar97 = (((((float)auVar152._8_4_ * fVar121 + fVar122) - fVar208) * fVar229 + fVar208)
                     - fStack_1180) * fVar236;
            fVar211 = (((((float)auVar152._12_4_ * fVar121 + fVar122) - fVar211) * fVar229 + fVar211
                       ) - fStack_117c) * fVar224;
            uVar165 = ((int)uVar138 < (int)uVar123) * uVar138 |
                      ((int)uVar138 >= (int)uVar123) * uVar123;
            uVar169 = ((int)uVar149 < (int)uVar135) * uVar149 |
                      ((int)uVar149 >= (int)uVar135) * uVar135;
            uVar170 = ((int)uVar150 < (int)uVar136) * uVar150 |
                      ((int)uVar150 >= (int)uVar136) * uVar136;
            uVar171 = ((int)uVar151 < (int)uVar137) * uVar151 |
                      ((int)uVar151 >= (int)uVar137) * uVar137;
            uVar123 = (uint)((int)fVar209 < (int)fVar164) * (int)fVar209 |
                      (uint)((int)fVar209 >= (int)fVar164) * (int)fVar164;
            uVar135 = (uint)((int)fVar188 < (int)fVar217) * (int)fVar188 |
                      (uint)((int)fVar188 >= (int)fVar217) * (int)fVar217;
            uVar136 = (uint)((int)fVar97 < (int)fVar222) * (int)fVar97 |
                      (uint)((int)fVar97 >= (int)fVar222) * (int)fVar222;
            uVar137 = (uint)((int)fVar211 < (int)fVar189) * (int)fVar211 |
                      (uint)((int)fVar211 >= (int)fVar189) * (int)fVar189;
            uVar138 = (uint)((int)fVar209 < (int)fVar164) * (int)fVar164 |
                      (uint)((int)fVar209 >= (int)fVar164) * (int)fVar209;
            uVar149 = (uint)((int)fVar188 < (int)fVar217) * (int)fVar217 |
                      (uint)((int)fVar188 >= (int)fVar217) * (int)fVar188;
            uVar150 = (uint)((int)fVar97 < (int)fVar222) * (int)fVar222 |
                      (uint)((int)fVar97 >= (int)fVar222) * (int)fVar97;
            uVar151 = (uint)((int)fVar211 < (int)fVar189) * (int)fVar189 |
                      (uint)((int)fVar211 >= (int)fVar189) * (int)fVar211;
            uVar123 = (uint)((int)uVar123 < (int)local_1198._0_4_) * local_1198._0_4_ |
                      ((int)uVar123 >= (int)local_1198._0_4_) * uVar123;
            uVar135 = (uint)((int)uVar135 < (int)local_1198._4_4_) * local_1198._4_4_ |
                      ((int)uVar135 >= (int)local_1198._4_4_) * uVar135;
            uVar136 = (uint)((int)uVar136 < (int)local_1198._8_4_) * local_1198._8_4_ |
                      ((int)uVar136 >= (int)local_1198._8_4_) * uVar136;
            uVar137 = (uint)((int)uVar137 < (int)local_1198._12_4_) * local_1198._12_4_ |
                      ((int)uVar137 >= (int)local_1198._12_4_) * uVar137;
            local_f88 = (float)(((int)uVar123 < (int)uVar53) * uVar53 |
                               ((int)uVar123 >= (int)uVar53) * uVar123);
            uStack_f84 = ((int)uVar135 < (int)uVar118) * uVar118 |
                         ((int)uVar135 >= (int)uVar118) * uVar135;
            uStack_f80 = ((int)uVar136 < (int)uVar119) * uVar119 |
                         ((int)uVar136 >= (int)uVar119) * uVar136;
            uStack_f7c = ((int)uVar137 < (int)uVar120) * uVar120 |
                         ((int)uVar137 >= (int)uVar120) * uVar137;
            iVar45 = auVar109._0_4_;
            uVar53 = (uint)(iVar45 < (int)uVar138) * iVar45 | (iVar45 >= (int)uVar138) * uVar138;
            iVar45 = auVar109._4_4_;
            uVar118 = (uint)(iVar45 < (int)uVar149) * iVar45 | (iVar45 >= (int)uVar149) * uVar149;
            iVar45 = auVar109._8_4_;
            uVar119 = (uint)(iVar45 < (int)uVar150) * iVar45 | (iVar45 >= (int)uVar150) * uVar150;
            iVar45 = auVar109._12_4_;
            uVar120 = (uint)(iVar45 < (int)uVar151) * iVar45 | (iVar45 >= (int)uVar151) * uVar151;
            auVar126._0_4_ =
                 -(uint)((int)(((int)uVar165 < (int)uVar53) * uVar165 |
                              ((int)uVar165 >= (int)uVar53) * uVar53) < (int)local_f88);
            auVar126._4_4_ =
                 -(uint)((int)(((int)uVar169 < (int)uVar118) * uVar169 |
                              ((int)uVar169 >= (int)uVar118) * uVar118) < (int)uStack_f84);
            auVar126._8_4_ =
                 -(uint)((int)(((int)uVar170 < (int)uVar119) * uVar170 |
                              ((int)uVar170 >= (int)uVar119) * uVar119) < (int)uStack_f80);
            auVar126._12_4_ =
                 -(uint)((int)(((int)uVar171 < (int)uVar120) * uVar171 |
                              ((int)uVar171 >= (int)uVar120) * uVar120) < (int)uStack_f7c);
            auVar218 = pmovsxbd(auVar76,auVar76);
            uVar53 = movmskps((int)local_1330,~auVar126 & auVar218);
            fVar189 = local_1158;
            fVar121 = fStack_1154;
            fVar122 = fStack_1150;
            fVar188 = fStack_114c;
            fVar190 = local_1168;
            fVar201 = fStack_1164;
            fVar205 = fStack_1160;
            fVar229 = fStack_115c;
            fVar172 = local_1178;
            fVar181 = fStack_1174;
            fVar184 = fStack_1170;
            fVar231 = fStack_116c;
            fVar217 = local_1208;
            fVar209 = fStack_1204;
            fVar164 = fStack_1200;
            fVar222 = fStack_11fc;
            if (uVar53 != 0) {
              local_1330 = local_1330 + uVar51;
              local_11a0 = (ulong)(uVar53 & 0xff);
              do {
                pRVar44 = local_11b0;
                auVar218 = _local_1308;
                pRVar59 = local_1400;
                lVar58 = 0;
                if (local_11a0 != 0) {
                  for (; (local_11a0 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                  }
                }
                fVar211 = (ray->super_RayK<1>).tfar;
                if ((&local_f88)[lVar58] <= fVar211) {
                  local_f98 = ZEXT416((uint)fVar211);
                  uVar18 = *(ushort *)(local_1330 + lVar58 * 8);
                  uVar53 = *(uint *)(local_1330 + 0x88);
                  local_1474._4_8_ = ZEXT48(uVar53);
                  uVar118 = *(uint *)(local_1330 + 4 + lVar58 * 8);
                  local_11a8 = pRVar65->scene;
                  pGVar21 = (local_11a8->geometries).items[local_1474._4_8_].ptr;
                  local_1474._20_8_ = (ulong)uVar118;
                  local_13b8 = (RayQueryContext *)
                               ((ulong)uVar118 *
                               pGVar21[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
                  uVar19 = *(ushort *)(local_1330 + 2 + lVar58 * 8);
                  fVar209 = (pGVar21->time_range).lower;
                  fVar209 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar209) /
                            ((pGVar21->time_range).upper - fVar209)) * pGVar21->fnumTimeSegments;
                  auVar127 = roundss(ZEXT816(0),ZEXT416((uint)fVar209),9);
                  fVar98 = pGVar21->fnumTimeSegments + -1.0;
                  if (fVar98 <= auVar127._0_4_) {
                    auVar127._0_4_ = fVar98;
                  }
                  fVar98 = 0.0;
                  if (0.0 <= auVar127._0_4_) {
                    fVar98 = auVar127._0_4_;
                  }
                  local_13c8 = *(long *)&pGVar21->field_0x58;
                  uVar120 = uVar18 & 0x7fff;
                  uVar119 = *(uint *)((long)&local_13b8->scene + local_13c8 + 4);
                  uVar57 = (ulong)uVar119;
                  uVar60 = (ulong)(uVar119 * (uVar19 & 0x7fff) +
                                  *(int *)((long)&local_13b8->scene + local_13c8) + uVar120);
                  lVar22 = *(long *)&pGVar21[2].numPrimitives;
                  lVar63 = (long)(int)fVar98 * 0x38;
                  lVar23 = *(long *)(lVar22 + 0x10 + lVar63);
                  lVar24 = *(long *)(lVar22 + lVar63);
                  puVar1 = (undefined8 *)(lVar24 + lVar23 * uVar60);
                  uVar48 = *puVar1;
                  lVar25 = *(long *)(lVar22 + 0x48 + lVar63);
                  pfVar14 = (float *)(lVar24 + (uVar60 + 1) * lVar23);
                  lVar58 = uVar57 + uVar60;
                  pfVar15 = (float *)(lVar24 + lVar58 * lVar23);
                  lVar66 = uVar57 + uVar60 + 1;
                  pfVar2 = (float *)(lVar24 + lVar66 * lVar23);
                  uVar55 = (ulong)(-1 < (short)uVar18);
                  lVar54 = uVar55 + uVar60 + 1;
                  pfVar3 = (float *)(lVar24 + lVar54 * lVar23);
                  lVar52 = uVar55 + lVar66;
                  uVar55 = 0;
                  if (-1 < (short)uVar19) {
                    uVar55 = uVar57;
                  }
                  pfVar4 = (float *)(lVar24 + lVar52 * lVar23);
                  pfVar5 = (float *)(lVar24 + (lVar58 + uVar55) * lVar23);
                  lVar47 = lVar25 * (lVar66 + uVar55);
                  pfVar6 = (float *)(lVar24 + (lVar66 + uVar55) * lVar23);
                  fStack_1390 = *(float *)(lVar24 + lVar23 * (uVar55 + lVar52) + 4);
                  lVar22 = *(long *)(lVar22 + 0x38 + lVar63);
                  pfVar7 = (float *)(lVar22 + lVar25 * uVar60);
                  pfVar8 = (float *)(lVar22 + lVar25 * (uVar60 + 1));
                  pfVar9 = (float *)(lVar22 + lVar25 * lVar58);
                  pfVar10 = (float *)(lVar22 + lVar25 * lVar66);
                  pfVar11 = (float *)(lVar22 + lVar25 * lVar54);
                  fVar209 = fVar209 - fVar98;
                  pfVar12 = (float *)(lVar22 + lVar25 * lVar52);
                  local_1488._0_4_ = (undefined4)uVar48;
                  local_1488._4_4_ = (undefined4)((ulong)uVar48 >> 0x20);
                  fStack_1480 = (float)puVar1[1];
                  pfVar13 = (float *)(lVar22 + lVar25 * (lVar58 + uVar55));
                  local_1308._0_4_ = (*pfVar8 - *pfVar14) * fVar209 + *pfVar14;
                  local_1078 = (pfVar8[1] - pfVar14[1]) * fVar209 + pfVar14[1];
                  local_1128 = (pfVar8[2] - pfVar14[2]) * fVar209 + pfVar14[2];
                  pfVar14 = (float *)(lVar22 + lVar47);
                  fVar188 = (*pfVar9 - *pfVar15) * fVar209 + *pfVar15;
                  fVar164 = (pfVar9[1] - pfVar15[1]) * fVar209 + pfVar15[1];
                  local_1438 = (pfVar9[2] - pfVar15[2]) * fVar209 + pfVar15[2];
                  local_1388._0_4_ = (*pfVar10 - *pfVar2) * fVar209 + *pfVar2;
                  local_1398 = (pfVar10[1] - pfVar2[1]) * fVar209 + pfVar2[1];
                  fVar97 = (pfVar10[2] - pfVar2[2]) * fVar209 + pfVar2[2];
                  local_1308._4_4_ = (*pfVar11 - *pfVar3) * fVar209 + *pfVar3;
                  fStack_1074 = (pfVar11[1] - pfVar3[1]) * fVar209 + pfVar3[1];
                  fStack_1124 = (pfVar11[2] - pfVar3[2]) * fVar209 + pfVar3[2];
                  local_1388._4_4_ = (*pfVar12 - *pfVar4) * fVar209 + *pfVar4;
                  fStack_1394 = (pfVar12[1] - pfVar4[1]) * fVar209 + pfVar4[1];
                  aStack_1444.field_0.x = (pfVar12[2] - pfVar4[2]) * fVar209 + pfVar4[2];
                  fStack_1084 = (*pfVar13 - *pfVar5) * fVar209 + *pfVar5;
                  fStack_107c = (pfVar13[1] - pfVar5[1]) * fVar209 + pfVar5[1];
                  fStack_142c = (pfVar13[2] - pfVar5[2]) * fVar209 + pfVar5[2];
                  local_1088 = (*pfVar14 - *pfVar6) * fVar209 + *pfVar6;
                  fStack_138c = (pfVar14[1] - pfVar6[1]) * fVar209 + pfVar6[1];
                  fStack_1430 = (pfVar14[2] - pfVar6[2]) * fVar209 + pfVar6[2];
                  fStack_1390 = (*(float *)(lVar22 + (uVar55 + lVar52) * lVar25 + 4) - fStack_1390)
                                * fVar209 + fStack_1390;
                  _fStack_1300 = auVar218._8_8_;
                  auVar109 = _local_1308;
                  local_1448._0_2_ = SUB42(fVar97,0);
                  local_1448._2_2_ = (undefined2)((uint)fVar97 >> 0x10);
                  local_1388 = CONCAT44(local_1388._4_4_,(float)local_1388);
                  local_1474._28_4_ = (local_11b0->super_RayK<1>).org.field_0.m128[0];
                  local_13a8 = (local_11b0->super_RayK<1>).org.field_0.m128[1];
                  fVar98 = (local_11b0->super_RayK<1>).org.field_0.m128[2];
                  fStack_13a4 = local_13a8;
                  fStack_13a0 = local_13a8;
                  fStack_139c = local_13a8;
                  local_fb8 = ((pfVar7[1] - (float)local_1488._4_4_) * fVar209 +
                              (float)local_1488._4_4_) - local_13a8;
                  fStack_fb4 = local_1078 - local_13a8;
                  fStack_fb0 = local_1398 - local_13a8;
                  fStack_fac = fVar164 - local_13a8;
                  local_fa8 = ((pfVar7[2] - fStack_1480) * fVar209 + fStack_1480) - fVar98;
                  fStack_fa4 = local_1128 - fVar98;
                  fStack_fa0 = fVar97 - fVar98;
                  fStack_f9c = local_1438 - fVar98;
                  fStack_1080 = fStack_138c;
                  local_1428[0] = (uint)(fVar164 - local_13a8);
                  auStack_1424[0] = (uint)(local_1398 - local_13a8);
                  fStack_1420 = fStack_138c - local_13a8;
                  fStack_141c = fStack_107c - local_13a8;
                  local_1048._4_4_ = fStack_142c;
                  local_1048._0_4_ = fStack_1430;
                  local_1438 = local_1438 - fVar98;
                  fStack_1434 = fVar97 - fVar98;
                  fStack_1430 = fStack_1430 - fVar98;
                  fStack_142c = fStack_142c - fVar98;
                  local_fd8 = (float)local_1428[0] - local_fb8;
                  fStack_fd4 = (float)auStack_1424[0] - fStack_fb4;
                  fStack_fd0 = fStack_1420 - fStack_fb0;
                  fStack_fcc = fStack_141c - fStack_fac;
                  local_fc8 = local_1438 - local_fa8;
                  fStack_fc4 = fStack_1434 - fStack_fa4;
                  fStack_fc0 = fStack_1430 - fStack_fa0;
                  fStack_fbc = fStack_142c - fStack_f9c;
                  fStack_1454 = (float)local_1474._28_4_;
                  fStack_1450 = (float)local_1474._28_4_;
                  fStack_144c = (float)local_1474._28_4_;
                  fVar184 = ((*pfVar7 - (float)local_1488._0_4_) * fVar209 + (float)local_1488._0_4_
                            ) - (float)local_1474._28_4_;
                  fVar231 = (float)local_1308._0_4_ - (float)local_1474._28_4_;
                  fStack_1490 = fStack_1490 - (float)local_1474._28_4_;
                  fStack_148c = fStack_148c - (float)local_1474._28_4_;
                  local_1098 = CONCAT44((float)local_1388,fVar188);
                  fVar188 = fVar188 - (float)local_1474._28_4_;
                  fVar164 = (float)local_1388 - (float)local_1474._28_4_;
                  fVar222 = local_1088 - (float)local_1474._28_4_;
                  fVar121 = fStack_1084 - (float)local_1474._28_4_;
                  local_fe8 = fVar188 - fVar184;
                  fStack_fe4 = fVar164 - fVar231;
                  fStack_fe0 = fVar222 - fStack_1490;
                  fStack_fdc = fVar121 - fStack_148c;
                  local_12c8 = (local_11b0->super_RayK<1>).dir.field_0.m128[0];
                  local_1488._4_4_ = (local_11b0->super_RayK<1>).dir.field_0.m128[1];
                  local_1378 = (local_11b0->super_RayK<1>).dir.field_0.m128[2];
                  local_1488._0_4_ = local_1488._4_4_;
                  fStack_1480 = (float)local_1488._4_4_;
                  fStack_147c = (float)local_1488._4_4_;
                  fVar162 = (local_fd8 * (local_1438 + local_fa8) -
                            local_fc8 * ((float)local_1428[0] + local_fb8)) * local_12c8 +
                            (local_fc8 * (fVar188 + fVar184) - (local_1438 + local_fa8) * local_fe8)
                            * (float)local_1488._4_4_ +
                            (((float)local_1428[0] + local_fb8) * local_fe8 -
                            (fVar188 + fVar184) * local_fd8) * local_1378;
                  fVar163 = (fStack_fd4 * (fStack_1434 + fStack_fa4) -
                            fStack_fc4 * ((float)auStack_1424[0] + fStack_fb4)) * local_12c8 +
                            (fStack_fc4 * (fVar164 + fVar231) -
                            (fStack_1434 + fStack_fa4) * fStack_fe4) * (float)local_1488._4_4_ +
                            (((float)auStack_1424[0] + fStack_fb4) * fStack_fe4 -
                            (fVar164 + fVar231) * fStack_fd4) * local_1378;
                  fVar187 = (fStack_fd0 * (fStack_1430 + fStack_fa0) -
                            fStack_fc0 * (fStack_1420 + fStack_fb0)) * local_12c8 +
                            (fStack_fc0 * (fVar222 + fStack_1490) -
                            (fStack_1430 + fStack_fa0) * fStack_fe0) * (float)local_1488._4_4_ +
                            ((fStack_1420 + fStack_fb0) * fStack_fe0 -
                            (fVar222 + fStack_1490) * fStack_fd0) * local_1378;
                  fVar235 = (fStack_fcc * (fStack_142c + fStack_f9c) -
                            fStack_fbc * (fStack_141c + fStack_fac)) * local_12c8 +
                            (fStack_fbc * (fVar121 + fStack_148c) -
                            (fStack_142c + fStack_f9c) * fStack_fdc) * (float)local_1488._4_4_ +
                            ((fStack_141c + fStack_fac) * fStack_fdc -
                            (fVar121 + fStack_148c) * fStack_fcc) * local_1378;
                  fStack_1070 = fStack_1394;
                  fStack_106c = local_1398;
                  local_1118 = local_1078 - local_13a8;
                  fStack_1114 = fStack_1074 - local_13a8;
                  fStack_1110 = fStack_1394 - local_13a8;
                  fStack_110c = local_1398 - local_13a8;
                  local_1068 = CONCAT44(fStack_1124,local_1128);
                  _local_1058 = CONCAT44(fVar97,aStack_1444.field_0.x);
                  local_1318 = fVar98;
                  fStack_1314 = fVar98;
                  fStack_1310 = fVar98;
                  fStack_130c = fVar98;
                  local_1128 = local_1128 - fVar98;
                  fStack_1124 = fStack_1124 - fVar98;
                  fStack_1120 = aStack_1444.field_0.x - fVar98;
                  fStack_111c = fVar97 - fVar98;
                  local_1008 = local_fb8 - local_1118;
                  fStack_1004 = fStack_fb4 - fStack_1114;
                  fStack_1000 = fStack_fb0 - fStack_1110;
                  fStack_ffc = fStack_fac - fStack_110c;
                  fVar205 = local_fa8 - local_1128;
                  fVar229 = fStack_fa4 - fStack_1124;
                  fVar172 = fStack_fa0 - fStack_1120;
                  fVar181 = fStack_f9c - fStack_111c;
                  fStack_1300 = auVar218._8_4_;
                  fStack_12fc = auVar218._12_4_;
                  local_1138 = (float)local_1308._0_4_ - (float)local_1474._28_4_;
                  fStack_1134 = (float)local_1308._4_4_ - (float)local_1474._28_4_;
                  fStack_1130 = fStack_1300 - (float)local_1474._28_4_;
                  fStack_112c = fStack_12fc - (float)local_1474._28_4_;
                  fVar174 = fVar184 - local_1138;
                  fVar183 = fVar231 - fStack_1134;
                  fVar186 = fStack_1490 - fStack_1130;
                  fVar233 = fStack_148c - fStack_112c;
                  auVar219._0_4_ =
                       (local_1008 * (local_fa8 + local_1128) - fVar205 * (local_fb8 + local_1118))
                       * local_12c8 +
                       (fVar205 * (fVar184 + local_1138) - (local_fa8 + local_1128) * fVar174) *
                       (float)local_1488._4_4_ +
                       ((local_fb8 + local_1118) * fVar174 - (fVar184 + local_1138) * local_1008) *
                       local_1378;
                  auVar219._4_4_ =
                       (fStack_1004 * (fStack_fa4 + fStack_1124) -
                       fVar229 * (fStack_fb4 + fStack_1114)) * local_12c8 +
                       (fVar229 * (fVar231 + fStack_1134) - (fStack_fa4 + fStack_1124) * fVar183) *
                       (float)local_1488._4_4_ +
                       ((fStack_fb4 + fStack_1114) * fVar183 - (fVar231 + fStack_1134) * fStack_1004
                       ) * local_1378;
                  auVar219._8_4_ =
                       (fStack_1000 * (fStack_fa0 + fStack_1120) -
                       fVar172 * (fStack_fb0 + fStack_1110)) * local_12c8 +
                       (fVar172 * (fStack_1490 + fStack_1130) - (fStack_fa0 + fStack_1120) * fVar186
                       ) * (float)local_1488._4_4_ +
                       ((fStack_fb0 + fStack_1110) * fVar186 -
                       (fStack_1490 + fStack_1130) * fStack_1000) * local_1378;
                  auVar219._12_4_ =
                       (fStack_ffc * (fStack_f9c + fStack_111c) -
                       fVar181 * (fStack_fac + fStack_110c)) * local_12c8 +
                       (fVar181 * (fStack_148c + fStack_112c) - (fStack_f9c + fStack_111c) * fVar233
                       ) * (float)local_1488._4_4_ +
                       ((fStack_fac + fStack_110c) * fVar233 -
                       (fStack_148c + fStack_112c) * fStack_ffc) * local_1378;
                  local_12d8 = local_1118 - (float)local_1428[0];
                  fStack_12d4 = fStack_1114 - (float)auStack_1424[0];
                  fStack_12d0 = fStack_1110 - fStack_1420;
                  fStack_12cc = fStack_110c - fStack_141c;
                  local_ff8 = local_1128 - local_1438;
                  fStack_ff4 = fStack_1124 - fStack_1434;
                  fStack_ff0 = fStack_1120 - fStack_1430;
                  fStack_fec = fStack_111c - fStack_142c;
                  local_10e8 = local_1118 + (float)local_1428[0];
                  fStack_10e4 = fStack_1114 + (float)auStack_1424[0];
                  fStack_10e0 = fStack_1110 + fStack_1420;
                  fStack_10dc = fStack_110c + fStack_141c;
                  local_1108 = local_1128 + local_1438;
                  fStack_1104 = fStack_1124 + fStack_1434;
                  fStack_1100 = fStack_1120 + fStack_1430;
                  fStack_10fc = fStack_111c + fStack_142c;
                  local_1018._0_8_ = CONCAT44(fVar163,fVar162);
                  local_1018._8_4_ = fVar187;
                  local_1018._12_4_ = fVar235;
                  fVar190 = local_1138 - fVar188;
                  fVar201 = fStack_1134 - fVar164;
                  fVar234 = fStack_1130 - fVar222;
                  fVar236 = fStack_112c - fVar121;
                  local_1328 = fVar188;
                  fStack_1324 = fVar164;
                  fStack_1320 = fVar222;
                  fStack_131c = fVar121;
                  local_10f8 = local_1138 + fVar188;
                  fStack_10f4 = fStack_1134 + fVar164;
                  fStack_10f0 = fStack_1130 + fVar222;
                  fStack_10ec = fStack_112c + fVar121;
                  fStack_1374 = local_1378;
                  fStack_1370 = local_1378;
                  fStack_136c = local_1378;
                  fStack_12c4 = local_12c8;
                  fStack_12c0 = local_12c8;
                  fStack_12bc = local_12c8;
                  auVar77._0_4_ =
                       (local_12d8 * local_1108 - local_ff8 * local_10e8) * local_12c8 +
                       (local_ff8 * local_10f8 - fVar190 * local_1108) * (float)local_1488._4_4_ +
                       (fVar190 * local_10e8 - local_12d8 * local_10f8) * local_1378;
                  auVar77._4_4_ =
                       (fStack_12d4 * fStack_1104 - fStack_ff4 * fStack_10e4) * local_12c8 +
                       (fStack_ff4 * fStack_10f4 - fVar201 * fStack_1104) * (float)local_1488._4_4_
                       + (fVar201 * fStack_10e4 - fStack_12d4 * fStack_10f4) * local_1378;
                  auVar77._8_4_ =
                       (fStack_12d0 * fStack_1100 - fStack_ff0 * fStack_10e0) * local_12c8 +
                       (fStack_ff0 * fStack_10f0 - fVar234 * fStack_1100) * (float)local_1488._4_4_
                       + (fVar234 * fStack_10e0 - fStack_12d0 * fStack_10f0) * local_1378;
                  auVar77._12_4_ =
                       (fStack_12cc * fStack_10fc - fStack_fec * fStack_10dc) * local_12c8 +
                       (fStack_fec * fStack_10ec - fVar236 * fStack_10fc) * (float)local_1488._4_4_
                       + (fVar236 * fStack_10dc - fStack_12cc * fStack_10ec) * local_1378;
                  local_1298._0_4_ = fVar162 + auVar219._0_4_ + auVar77._0_4_;
                  local_1298._4_4_ = fVar163 + auVar219._4_4_ + auVar77._4_4_;
                  local_1298._8_4_ = fVar187 + auVar219._8_4_ + auVar77._8_4_;
                  local_1298._12_4_ = fVar235 + auVar219._12_4_ + auVar77._12_4_;
                  auVar128._8_4_ = fVar187;
                  auVar128._0_8_ = local_1018._0_8_;
                  auVar128._12_4_ = fVar235;
                  auVar218 = minps(auVar128,auVar219);
                  auVar218 = minps(auVar218,auVar77);
                  auVar124 = maxps(local_1018,auVar219);
                  auVar124 = maxps(auVar124,auVar77);
                  fVar209 = ABS(local_1298._0_4_);
                  fVar217 = ABS(local_1298._4_4_);
                  fVar189 = ABS(local_1298._8_4_);
                  fVar122 = ABS(local_1298._12_4_);
                  auVar168._0_4_ =
                       -(uint)(auVar124._0_4_ <= fVar209 * 1.1920929e-07 ||
                              -(fVar209 * 1.1920929e-07) <= auVar218._0_4_) & local_1148;
                  auVar168._4_4_ =
                       -(uint)(auVar124._4_4_ <= fVar217 * 1.1920929e-07 ||
                              -(fVar217 * 1.1920929e-07) <= auVar218._4_4_) & uStack_1144;
                  auVar168._8_4_ =
                       -(uint)(auVar124._8_4_ <= fVar189 * 1.1920929e-07 ||
                              -(fVar189 * 1.1920929e-07) <= auVar218._8_4_) & uStack_1140;
                  auVar168._12_4_ =
                       -(uint)(auVar124._12_4_ <= fVar122 * 1.1920929e-07 ||
                              -(fVar122 * 1.1920929e-07) <= auVar218._12_4_) & uStack_113c;
                  iVar45 = movmskps((int)lVar47,auVar168);
                  local_12e8 = ZEXT416(uVar120);
                  local_12f8 = ZEXT416((uint)local_1388._4_4_);
                  context = local_13b8;
                  lVar58 = local_13c8;
                  uVar51 = local_14a0;
                  if (iVar45 == 0) {
LAB_00db1f78:
                    uVar119 = 0;
                  }
                  else {
                    local_1038 = fVar209;
                    fStack_1034 = fVar217;
                    fStack_1030 = fVar189;
                    fStack_102c = fVar122;
                    local_1028 = auVar219;
                    auVar220._0_4_ = local_fd8 * fVar205 - local_fc8 * local_1008;
                    auVar220._4_4_ = fStack_fd4 * fVar229 - fStack_fc4 * fStack_1004;
                    auVar220._8_4_ = fStack_fd0 * fVar172 - fStack_fc0 * fStack_1000;
                    auVar220._12_4_ = fStack_fcc * fVar181 - fStack_fbc * fStack_ffc;
                    auVar216._0_4_ = local_1008 * local_ff8 - fVar205 * local_12d8;
                    auVar216._4_4_ = fStack_1004 * fStack_ff4 - fVar229 * fStack_12d4;
                    auVar216._8_4_ = fStack_1000 * fStack_ff0 - fVar172 * fStack_12d0;
                    auVar216._12_4_ = fStack_ffc * fStack_fec - fVar181 * fStack_12cc;
                    auVar78._4_4_ =
                         -(uint)(ABS(fStack_fc4 * fStack_1004) < ABS(fVar229 * fStack_12d4));
                    auVar78._0_4_ = -(uint)(ABS(local_fc8 * local_1008) < ABS(fVar205 * local_12d8))
                    ;
                    auVar78._8_4_ =
                         -(uint)(ABS(fStack_fc0 * fStack_1000) < ABS(fVar172 * fStack_12d0));
                    auVar78._12_4_ =
                         -(uint)(ABS(fStack_fbc * fStack_ffc) < ABS(fVar181 * fStack_12cc));
                    local_1238 = blendvps(auVar216,auVar220,auVar78);
                    auVar103._0_4_ = local_fc8 * fVar174 - local_fe8 * fVar205;
                    auVar103._4_4_ = fStack_fc4 * fVar183 - fStack_fe4 * fVar229;
                    auVar103._8_4_ = fStack_fc0 * fVar186 - fStack_fe0 * fVar172;
                    auVar103._12_4_ = fStack_fbc * fVar233 - fStack_fdc * fVar181;
                    auVar213._0_4_ = fVar205 * fVar190 - fVar174 * local_ff8;
                    auVar213._4_4_ = fVar229 * fVar201 - fVar183 * fStack_ff4;
                    auVar213._8_4_ = fVar172 * fVar234 - fVar186 * fStack_ff0;
                    auVar213._12_4_ = fVar181 * fVar236 - fVar233 * fStack_fec;
                    auVar79._4_4_ = -(uint)(ABS(fStack_fe4 * fVar229) < ABS(fVar183 * fStack_ff4));
                    auVar79._0_4_ = -(uint)(ABS(local_fe8 * fVar205) < ABS(fVar174 * local_ff8));
                    auVar79._8_4_ = -(uint)(ABS(fStack_fe0 * fVar172) < ABS(fVar186 * fStack_ff0));
                    auVar79._12_4_ = -(uint)(ABS(fStack_fdc * fVar181) < ABS(fVar233 * fStack_fec));
                    local_1228 = blendvps(auVar213,auVar103,auVar79);
                    fVar190 = local_1008 * fVar190;
                    fVar201 = fStack_1004 * fVar201;
                    auVar239._0_4_ = local_fe8 * local_1008 - local_fd8 * fVar174;
                    auVar239._4_4_ = fStack_fe4 * fStack_1004 - fStack_fd4 * fVar183;
                    auVar239._8_4_ = fStack_fe0 * fStack_1000 - fStack_fd0 * fVar186;
                    auVar239._12_4_ = fStack_fdc * fStack_ffc - fStack_fcc * fVar233;
                    auVar179._0_4_ = fVar174 * local_12d8 - fVar190;
                    auVar179._4_4_ = fVar183 * fStack_12d4 - fVar201;
                    auVar179._8_4_ = fVar186 * fStack_12d0 - fStack_1000 * fVar234;
                    auVar179._12_4_ = fVar233 * fStack_12cc - fStack_ffc * fVar236;
                    auVar195._0_8_ = CONCAT44(fVar201,fVar190) & 0x7fffffff7fffffff;
                    auVar195._8_4_ = ABS(fStack_1000 * fVar234);
                    auVar195._12_4_ = ABS(fStack_ffc * fVar236);
                    auVar80._4_4_ = -(uint)(ABS(fStack_fd4 * fVar183) < ABS(fVar201));
                    auVar80._0_4_ = -(uint)(ABS(local_fd8 * fVar174) < ABS(fVar190));
                    auVar80._8_4_ = -(uint)(ABS(fStack_fd0 * fVar186) < auVar195._8_4_);
                    auVar80._12_4_ = -(uint)(ABS(fStack_fcc * fVar233) < auVar195._12_4_);
                    local_1218 = blendvps(auVar179,auVar239,auVar80);
                    fVar174 = local_12c8 * local_1238._0_4_ +
                              (float)local_1488._4_4_ * local_1228._0_4_ +
                              local_1378 * local_1218._0_4_;
                    fVar183 = local_12c8 * local_1238._4_4_ +
                              (float)local_1488._4_4_ * local_1228._4_4_ +
                              local_1378 * local_1218._4_4_;
                    fVar186 = local_12c8 * local_1238._8_4_ +
                              (float)local_1488._4_4_ * local_1228._8_4_ +
                              local_1378 * local_1218._8_4_;
                    fVar233 = local_12c8 * local_1238._12_4_ +
                              (float)local_1488._4_4_ * local_1228._12_4_ +
                              local_1378 * local_1218._12_4_;
                    auVar81._0_4_ = fVar174 + fVar174;
                    auVar81._4_4_ = fVar183 + fVar183;
                    auVar81._8_4_ = fVar186 + fVar186;
                    auVar81._12_4_ = fVar233 + fVar233;
                    auVar104._0_4_ = local_fa8 * local_1218._0_4_;
                    auVar104._4_4_ = fStack_fa4 * local_1218._4_4_;
                    auVar104._8_4_ = fStack_fa0 * local_1218._8_4_;
                    auVar104._12_4_ = fStack_f9c * local_1218._12_4_;
                    fVar190 = fVar184 * local_1238._0_4_ +
                              local_fb8 * local_1228._0_4_ + auVar104._0_4_;
                    fVar205 = fVar231 * local_1238._4_4_ +
                              fStack_fb4 * local_1228._4_4_ + auVar104._4_4_;
                    fVar229 = fStack_1490 * local_1238._8_4_ +
                              fStack_fb0 * local_1228._8_4_ + auVar104._8_4_;
                    fVar172 = fStack_148c * local_1238._12_4_ +
                              fStack_fac * local_1228._12_4_ + auVar104._12_4_;
                    auVar218 = rcpps(auVar104,auVar81);
                    fVar174 = auVar218._0_4_;
                    fVar183 = auVar218._4_4_;
                    fVar186 = auVar218._8_4_;
                    fVar233 = auVar218._12_4_;
                    auVar129._0_4_ =
                         ((1.0 - auVar81._0_4_ * fVar174) * fVar174 + fVar174) * (fVar190 + fVar190)
                    ;
                    auVar129._4_4_ =
                         ((1.0 - auVar81._4_4_ * fVar183) * fVar183 + fVar183) * (fVar205 + fVar205)
                    ;
                    auVar129._8_4_ =
                         ((1.0 - auVar81._8_4_ * fVar186) * fVar186 + fVar186) * (fVar229 + fVar229)
                    ;
                    auVar129._12_4_ =
                         ((1.0 - auVar81._12_4_ * fVar233) * fVar233 + fVar233) *
                         (fVar172 + fVar172);
                    fVar174 = (local_11b0->super_RayK<1>).org.field_0.m128[3];
                    auVar82._0_4_ =
                         (int)((uint)((auVar129._0_4_ <= fVar211 && fVar174 <= auVar129._0_4_) &&
                                     auVar81._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar82._4_4_ =
                         (int)((uint)((auVar129._4_4_ <= fVar211 && fVar174 <= auVar129._4_4_) &&
                                     auVar81._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar82._8_4_ =
                         (int)((uint)((auVar129._8_4_ <= fVar211 && fVar174 <= auVar129._8_4_) &&
                                     auVar81._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar82._12_4_ =
                         (int)((uint)((auVar129._12_4_ <= fVar211 && fVar174 <= auVar129._12_4_) &&
                                     auVar81._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                    auVar83 = auVar82 & auVar168;
                    iVar45 = movmskps(iVar45,auVar83);
                    if (iVar45 == 0) goto LAB_00db1f78;
                    local_1288 = &local_14a1;
                    local_1278 = auVar83;
                    local_1248 = auVar129;
                    fVar211 = (float)(int)(*(ushort *)((long)&local_13b8->user + local_13c8) - 1);
                    auVar218 = rcpss(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211));
                    auVar196._4_12_ = auVar195._4_12_;
                    auVar196._0_4_ =
                         (float)(int)(*(ushort *)((long)&local_13b8->user + local_13c8 + 2) - 1);
                    fStack_12ac = (2.0 - fVar211 * auVar218._0_4_) * auVar218._0_4_;
                    auVar180._4_4_ = ABS(fVar201);
                    auVar180._0_4_ = auVar196._0_4_;
                    auVar180._8_4_ = auVar195._8_4_;
                    auVar180._12_4_ = auVar195._12_4_;
                    auVar218 = rcpss(auVar180,auVar196);
                    fVar211 = (2.0 - auVar196._0_4_ * auVar218._0_4_) * auVar218._0_4_;
                    local_12b8._0_4_ = fStack_12ac * (fVar162 + (float)uVar120 * local_1298._0_4_);
                    local_12b8._4_4_ =
                         fStack_12ac * (fVar163 + (float)(uVar120 + 1) * local_1298._4_4_);
                    fStack_12b0 = fStack_12ac * (fVar187 + (float)(uVar120 + 1) * local_1298._8_4_);
                    fStack_12ac = fStack_12ac * (fVar235 + (float)uVar120 * local_1298._12_4_);
                    auVar161._0_4_ =
                         (float)(int)local_1388._4_4_ * local_1298._0_4_ + auVar219._0_4_;
                    auVar161._4_4_ =
                         (float)(int)local_1388._4_4_ * local_1298._4_4_ + auVar219._4_4_;
                    auVar161._8_4_ =
                         (float)((int)local_1388._4_4_ + 1) * local_1298._8_4_ + auVar219._8_4_;
                    auVar161._12_4_ =
                         (float)((int)local_1388._4_4_ + 1) * local_1298._12_4_ + auVar219._12_4_;
                    local_12a8 = fVar211 * auVar161._0_4_;
                    fStack_12a4 = fVar211 * auVar161._4_4_;
                    fStack_12a0 = fVar211 * auVar161._8_4_;
                    fStack_129c = fVar211 * auVar161._12_4_;
                    pGVar21 = (local_11a8->geometries).items[local_1474._4_8_].ptr;
                    uVar119 = (local_11b0->super_RayK<1>).mask;
                    if ((pGVar21->mask & uVar119) != 0) {
                      local_1418 = auVar83;
                      auVar218 = rcpps(auVar161,local_1298);
                      fVar174 = auVar218._0_4_;
                      fVar183 = auVar218._4_4_;
                      fVar186 = auVar218._8_4_;
                      fVar233 = auVar218._12_4_;
                      fVar209 = (float)(-(uint)(1e-18 <= fVar209) &
                                       (uint)(((float)DAT_01f7ba10 - local_1298._0_4_ * fVar174) *
                                              fVar174 + fVar174));
                      fVar217 = (float)(-(uint)(1e-18 <= fVar217) &
                                       (uint)((DAT_01f7ba10._4_4_ - local_1298._4_4_ * fVar183) *
                                              fVar183 + fVar183));
                      fVar189 = (float)(-(uint)(1e-18 <= fVar189) &
                                       (uint)((DAT_01f7ba10._8_4_ - local_1298._8_4_ * fVar186) *
                                              fVar186 + fVar186));
                      fVar122 = (float)(-(uint)(1e-18 <= fVar122) &
                                       (uint)((DAT_01f7ba10._12_4_ - local_1298._12_4_ * fVar233) *
                                              fVar233 + fVar233));
                      auVar105._0_4_ = (float)local_12b8._0_4_ * fVar209;
                      auVar105._4_4_ = (float)local_12b8._4_4_ * fVar217;
                      auVar105._8_4_ = fStack_12b0 * fVar189;
                      auVar105._12_4_ = fStack_12ac * fVar122;
                      local_1268 = minps(auVar105,_DAT_01f7ba10);
                      auVar143._0_4_ = fVar211 * auVar161._0_4_ * fVar209;
                      auVar143._4_4_ = fVar211 * auVar161._4_4_ * fVar217;
                      auVar143._8_4_ = fVar211 * auVar161._8_4_ * fVar189;
                      auVar143._12_4_ = fVar211 * auVar161._12_4_ * fVar122;
                      local_1258 = minps(auVar143,_DAT_01f7ba10);
                      auVar124 = blendvps(_DAT_01f7a9f0,auVar129,auVar83);
                      auVar130._4_4_ = auVar124._0_4_;
                      auVar130._0_4_ = auVar124._4_4_;
                      auVar130._8_4_ = auVar124._12_4_;
                      auVar130._12_4_ = auVar124._8_4_;
                      auVar218 = minps(auVar130,auVar124);
                      auVar106._0_8_ = auVar218._8_8_;
                      auVar106._8_4_ = auVar218._0_4_;
                      auVar106._12_4_ = auVar218._4_4_;
                      auVar218 = minps(auVar106,auVar218);
                      auVar107._0_8_ =
                           CONCAT44(-(uint)(auVar218._4_4_ == auVar124._4_4_) & auVar83._4_4_,
                                    -(uint)(auVar218._0_4_ == auVar124._0_4_) & auVar83._0_4_);
                      auVar107._8_4_ = -(uint)(auVar218._8_4_ == auVar124._8_4_) & auVar83._8_4_;
                      auVar107._12_4_ = -(uint)(auVar218._12_4_ == auVar124._12_4_) & auVar83._12_4_
                      ;
                      iVar45 = movmskps(uVar119,auVar107);
                      if (iVar45 != 0) {
                        auVar83._8_4_ = auVar107._8_4_;
                        auVar83._0_8_ = auVar107._0_8_;
                        auVar83._12_4_ = auVar107._12_4_;
                      }
                      uVar119 = movmskps(iVar45,auVar83);
                      lVar58 = 0;
                      if (uVar119 != 0) {
                        for (; (uVar119 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                        }
                      }
                      pRVar26 = local_1400->args;
                      if ((pRVar26->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        fVar209 = *(float *)(local_1268 + lVar58 * 4);
                        fVar211 = *(float *)(local_1258 + lVar58 * 4);
                        fVar217 = *(float *)(local_1238 + lVar58 * 4);
                        fVar189 = *(float *)(local_1228 + lVar58 * 4);
                        fVar122 = *(float *)(local_1218 + lVar58 * 4);
                        (local_11b0->super_RayK<1>).tfar = *(float *)(local_1248 + lVar58 * 4);
                        (local_11b0->Ng).field_0.field_0.x = fVar217;
                        (local_11b0->Ng).field_0.field_0.y = fVar189;
                        (local_11b0->Ng).field_0.field_0.z = fVar122;
                        local_11b0->u = fVar209;
                        local_11b0->v = fVar211;
                        local_11b0->primID = uVar118;
                        local_11b0->geomID = uVar53;
                        pRVar56 = local_1400->user;
                        local_11b0->instID[0] = pRVar56->instID[0];
                        uVar119 = pRVar56->instPrimID[0];
                        local_11b0->instPrimID[0] = uVar119;
                      }
                      else {
                        pRVar56 = local_1400->user;
                        _local_1488 = ZEXT416((uint)(local_11b0->super_RayK<1>).tfar);
                        _local_1498 = auVar129;
                        _local_1308 = auVar109;
LAB_00db1c4e:
                        local_135c = *(undefined4 *)(local_1268 + lVar58 * 4);
                        local_1358 = *(undefined4 *)(local_1258 + lVar58 * 4);
                        (pRVar44->super_RayK<1>).tfar = *(float *)(local_1248 + lVar58 * 4);
                        local_1368 = *(float *)(local_1238 + lVar58 * 4);
                        local_1364 = *(undefined4 *)(local_1228 + lVar58 * 4);
                        local_1360 = *(undefined4 *)(local_1218 + lVar58 * 4);
                        local_1354 = (int)local_1474._20_8_;
                        local_1350 = (int)local_1474._4_8_;
                        local_134c = pRVar56->instID[0];
                        local_1348 = pRVar56->instPrimID[0];
                        local_1474._0_4_ = -NAN;
                        local_13f8.valid = (int *)local_1474;
                        local_13f8.geometryUserPtr = pGVar21->userPtr;
                        local_13f8.context = pRVar56;
                        local_13f8.ray = (RTCRayN *)pRVar44;
                        local_13f8.hit = (RTCHitN *)&local_1368;
                        local_13f8.N = 1;
                        local_1448 = fVar97;
                        if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00db1d5f:
                          if ((pRVar26->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar26->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar26->filter)(&local_13f8);
                            uVar51 = local_14a0;
                            auVar129 = _local_1498;
                            fVar97 = local_1448;
                            if ((((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00db1df2;
                          }
                          (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_13f8.hit;
                          (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_13f8.hit + 4);
                          (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_13f8.hit + 8);
                          *(float *)((long)local_13f8.ray + 0x3c) = *(float *)(local_13f8.hit + 0xc)
                          ;
                          *(float *)((long)local_13f8.ray + 0x40) =
                               *(float *)(local_13f8.hit + 0x10);
                          *(float *)((long)local_13f8.ray + 0x44) =
                               *(float *)(local_13f8.hit + 0x14);
                          *(float *)((long)local_13f8.ray + 0x48) =
                               *(float *)(local_13f8.hit + 0x18);
                          *(float *)((long)local_13f8.ray + 0x4c) =
                               *(float *)(local_13f8.hit + 0x1c);
                          *(float *)((long)local_13f8.ray + 0x50) =
                               *(float *)(local_13f8.hit + 0x20);
                          pRVar50 = (RayHit *)local_13f8.ray;
                          fVar97 = local_1448;
                        }
                        else {
                          (*pGVar21->intersectionFilterN)(&local_13f8);
                          uVar51 = local_14a0;
                          auVar129 = _local_1498;
                          fVar97 = local_1448;
                          if ((((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00db1d5f;
LAB_00db1df2:
                          (pRVar44->super_RayK<1>).tfar = (float)local_1488._0_4_;
                          pRVar50 = (RayHit *)local_13f8.valid;
                          uVar51 = local_14a0;
                          auVar129 = _local_1498;
                        }
                        *(undefined4 *)(local_1418 + lVar58 * 4) = 0;
                        fVar209 = (pRVar44->super_RayK<1>).tfar;
                        local_1488._0_4_ = (pRVar44->super_RayK<1>).tfar;
                        local_1488._4_4_ = (pRVar44->super_RayK<1>).mask;
                        fStack_1480 = (float)(pRVar44->super_RayK<1>).id;
                        fStack_147c = (float)(pRVar44->super_RayK<1>).flags;
                        auVar89._0_4_ = -(uint)(auVar129._0_4_ <= fVar209) & local_1418._0_4_;
                        auVar89._4_4_ = -(uint)(auVar129._4_4_ <= fVar209) & local_1418._4_4_;
                        auVar89._8_4_ = -(uint)(auVar129._8_4_ <= fVar209) & local_1418._8_4_;
                        auVar89._12_4_ = -(uint)(auVar129._12_4_ <= fVar209) & local_1418._12_4_;
                        local_1418 = auVar89;
                        iVar45 = movmskps((int)pRVar50,auVar89);
                        if (iVar45 != 0) {
                          auVar109 = blendvps(_DAT_01f7a9f0,auVar129,auVar89);
                          auVar147._4_4_ = auVar109._0_4_;
                          auVar147._0_4_ = auVar109._4_4_;
                          auVar147._8_4_ = auVar109._12_4_;
                          auVar147._12_4_ = auVar109._8_4_;
                          auVar218 = minps(auVar147,auVar109);
                          auVar114._0_8_ = auVar218._8_8_;
                          auVar114._8_4_ = auVar218._0_4_;
                          auVar114._12_4_ = auVar218._4_4_;
                          auVar218 = minps(auVar114,auVar218);
                          auVar115._0_8_ =
                               CONCAT44(-(uint)(auVar218._4_4_ == auVar109._4_4_) & auVar89._4_4_,
                                        -(uint)(auVar218._0_4_ == auVar109._0_4_) & auVar89._0_4_);
                          auVar115._8_4_ = -(uint)(auVar218._8_4_ == auVar109._8_4_) & auVar89._8_4_
                          ;
                          auVar115._12_4_ =
                               -(uint)(auVar218._12_4_ == auVar109._12_4_) & auVar89._12_4_;
                          iVar45 = movmskps(iVar45,auVar115);
                          if (iVar45 != 0) {
                            auVar89._8_4_ = auVar115._8_4_;
                            auVar89._0_8_ = auVar115._0_8_;
                            auVar89._12_4_ = auVar115._12_4_;
                          }
                          uVar46 = movmskps(iVar45,auVar89);
                          uVar55 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar46);
                          lVar58 = 0;
                          if (uVar55 != 0) {
                            for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                            }
                          }
                          goto LAB_00db1c4e;
                        }
                        local_1474._28_4_ = (pRVar44->super_RayK<1>).org.field_0.m128[0];
                        local_13a8 = (pRVar44->super_RayK<1>).org.field_0.m128[1];
                        fVar98 = (pRVar44->super_RayK<1>).org.field_0.m128[2];
                        local_12c8 = (pRVar44->super_RayK<1>).dir.field_0.m128[0];
                        local_1488._4_4_ =
                             *(float *)((long)&(pRVar44->super_RayK<1>).dir.field_0 + 4);
                        local_1378 = (pRVar44->super_RayK<1>).dir.field_0.m128[2];
                        fStack_12c4 = local_12c8;
                        fStack_12c0 = local_12c8;
                        fStack_12bc = local_12c8;
                        fVar188 = (float)local_1098 - (float)local_1474._28_4_;
                        fVar164 = local_1098._4_4_ - (float)local_1474._28_4_;
                        fVar222 = fStack_1090 - (float)local_1474._28_4_;
                        fVar121 = fStack_108c - (float)local_1474._28_4_;
                        local_1428[0] = (uint)(local_1088 - local_13a8);
                        auStack_1424[0] = (uint)(fStack_1084 - local_13a8);
                        fStack_1420 = fStack_1080 - local_13a8;
                        fStack_141c = fStack_107c - local_13a8;
                        local_1438 = local_1058 - fVar98;
                        fStack_1434 = fStack_1054 - fVar98;
                        fStack_1430 = fStack_1050 - fVar98;
                        fStack_142c = fStack_104c - fVar98;
                        local_10f8 = fVar188 + ((float)local_1308._0_4_ - (float)local_1474._28_4_);
                        fStack_10f4 = fVar164 + ((float)local_1308._4_4_ - (float)local_1474._28_4_)
                        ;
                        fStack_10f0 = fVar222 + (fStack_1300 - (float)local_1474._28_4_);
                        fStack_10ec = fVar121 + (fStack_12fc - (float)local_1474._28_4_);
                        local_10e8 = (float)local_1428[0] + (local_1078 - local_13a8);
                        fStack_10e4 = (float)auStack_1424[0] + (fStack_1074 - local_13a8);
                        fStack_10e0 = fStack_1420 + (fStack_1070 - local_13a8);
                        fStack_10dc = fStack_141c + (fStack_106c - local_13a8);
                        local_1108 = local_1438 + ((float)local_1068 - fVar98);
                        fStack_1104 = fStack_1434 + (local_1068._4_4_ - fVar98);
                        fStack_1100 = fStack_1430 + (fStack_1060 - fVar98);
                        fStack_10fc = fStack_142c + (fStack_105c - fVar98);
                        local_1128 = (float)local_1068 - fVar98;
                        fStack_1124 = local_1068._4_4_ - fVar98;
                        fStack_1120 = fStack_1060 - fVar98;
                        fStack_111c = fStack_105c - fVar98;
                        local_1118 = local_1078 - local_13a8;
                        fStack_1114 = fStack_1074 - local_13a8;
                        fStack_1110 = fStack_1070 - local_13a8;
                        fStack_110c = fStack_106c - local_13a8;
                        local_1138 = (float)local_1308._0_4_ - (float)local_1474._28_4_;
                        fStack_1134 = (float)local_1308._4_4_ - (float)local_1474._28_4_;
                        fStack_1130 = fStack_1300 - (float)local_1474._28_4_;
                        fStack_112c = fStack_12fc - (float)local_1474._28_4_;
                        uVar119 = 0;
                      }
                      local_1488._0_4_ = local_1488._4_4_;
                      fStack_1480 = (float)local_1488._4_4_;
                      fStack_147c = (float)local_1488._4_4_;
                      fStack_1374 = local_1378;
                      fStack_1370 = local_1378;
                      fStack_136c = local_1378;
                      context = local_13b8;
                      lVar58 = local_13c8;
                    }
                  }
                  fVar97 = fVar97 - fVar98;
                  aStack_1444.field_0.x = aStack_1444.field_0.x - fVar98;
                  aStack_1444.field_0.y = aStack_1444.field_0.y - fVar98;
                  aStack_1444.field_0.z = aStack_1444.field_0.z - fVar98;
                  local_1398 = local_1398 - local_13a8;
                  fStack_1394 = fStack_1394 - local_13a8;
                  fStack_1390 = fStack_1390 - local_13a8;
                  fStack_138c = fStack_138c - local_13a8;
                  local_1388._0_4_ = (float)local_1388 - (float)local_1474._28_4_;
                  local_1388._4_4_ = local_1388._4_4_ - (float)local_1474._28_4_;
                  fStack_1380 = fStack_1380 - (float)local_1474._28_4_;
                  fStack_137c = fStack_137c - (float)local_1474._28_4_;
                  local_12d8 = local_1138 - (float)local_1388;
                  fStack_12d4 = fStack_1134 - local_1388._4_4_;
                  fStack_12d0 = fStack_1130 - fStack_1380;
                  fStack_12cc = fStack_112c - fStack_137c;
                  fVar207 = local_1118 - local_1398;
                  fVar210 = fStack_1114 - fStack_1394;
                  fVar225 = fStack_1110 - fStack_1390;
                  fVar227 = fStack_110c - fStack_138c;
                  local_13a8 = local_1128 - fVar97;
                  fStack_13a4 = fStack_1124 - aStack_1444.field_0.x;
                  fStack_13a0 = fStack_1120 - aStack_1444.field_0.y;
                  fStack_139c = fStack_111c - aStack_1444.field_0.z;
                  local_1474._28_4_ = (float)local_1428[0] - local_1118;
                  fStack_1454 = (float)auStack_1424[0] - fStack_1114;
                  fStack_1450 = fStack_1420 - fStack_1110;
                  fStack_144c = fStack_141c - fStack_110c;
                  fVar173 = local_1438 - local_1128;
                  fVar182 = fStack_1434 - fStack_1124;
                  fVar185 = fStack_1430 - fStack_1120;
                  fVar191 = fStack_142c - fStack_111c;
                  fVar211 = fVar188 - local_1138;
                  fVar162 = fVar164 - fStack_1134;
                  fVar163 = fVar222 - fStack_1130;
                  fVar187 = fVar121 - fStack_112c;
                  local_1498._4_4_ = fVar210;
                  local_1498._0_4_ = fVar207;
                  fStack_1490 = fVar225;
                  fStack_148c = fVar227;
                  fVar208 = local_1398 - (float)local_1428[0];
                  fVar223 = fStack_1394 - (float)auStack_1424[0];
                  fVar226 = fStack_1390 - fStack_1420;
                  fVar228 = fStack_138c - fStack_141c;
                  local_1448._0_2_ = SUB42(fVar97,0);
                  local_1448._2_2_ = (undefined2)((uint)fVar97 >> 0x10);
                  fVar238 = fVar97 - local_1438;
                  fVar242 = aStack_1444.field_0.x - fStack_1434;
                  fVar244 = aStack_1444.field_0.y - fStack_1430;
                  fVar245 = aStack_1444.field_0.z - fStack_142c;
                  fVar230 = (fVar207 * (local_1128 + fVar97) -
                            local_13a8 * (local_1118 + local_1398)) * fStack_12bc +
                            (local_13a8 * (local_1138 + (float)local_1388) -
                            (local_1128 + fVar97) * local_12d8) * (float)local_1488._0_4_ +
                            ((local_1118 + local_1398) * local_12d8 -
                            (local_1138 + (float)local_1388) * fVar207) * fStack_1374;
                  fVar232 = (fVar210 * (fStack_1124 + aStack_1444.field_0.x) -
                            fStack_13a4 * (fStack_1114 + fStack_1394)) * fStack_12bc +
                            (fStack_13a4 * (fStack_1134 + local_1388._4_4_) -
                            (fStack_1124 + aStack_1444.field_0.x) * fStack_12d4) *
                            (float)local_1488._4_4_ +
                            ((fStack_1114 + fStack_1394) * fStack_12d4 -
                            (fStack_1134 + local_1388._4_4_) * fVar210) * fStack_1374;
                  fStack_13b0 = (fVar225 * (fStack_1120 + aStack_1444.field_0.y) -
                                fStack_13a0 * (fStack_1110 + fStack_1390)) * fStack_12bc +
                                (fStack_13a0 * (fStack_1130 + fStack_1380) -
                                (fStack_1120 + aStack_1444.field_0.y) * fStack_12d0) * fStack_1480 +
                                ((fStack_1110 + fStack_1390) * fStack_12d0 -
                                (fStack_1130 + fStack_1380) * fVar225) * fStack_1374;
                  fStack_13ac = (fVar227 * (fStack_111c + aStack_1444.field_0.z) -
                                fStack_139c * (fStack_110c + fStack_138c)) * fStack_12bc +
                                (fStack_139c * (fStack_112c + fStack_137c) -
                                (fStack_111c + aStack_1444.field_0.z) * fStack_12cc) * fStack_147c +
                                ((fStack_110c + fStack_138c) * fStack_12cc -
                                (fStack_112c + fStack_137c) * fVar227) * fStack_1374;
                  fVar202 = (float)local_1388 - fVar188;
                  fVar203 = local_1388._4_4_ - fVar164;
                  fVar204 = fStack_1380 - fVar222;
                  fVar206 = fStack_137c - fVar121;
                  fVar192 = (fVar208 * (local_1438 + fVar97) -
                            fVar238 * ((float)local_1428[0] + local_1398)) * fStack_12bc +
                            (fVar238 * (fVar188 + (float)local_1388) -
                            (local_1438 + fVar97) * fVar202) * (float)local_1488._0_4_ +
                            (((float)local_1428[0] + local_1398) * fVar202 -
                            (fVar188 + (float)local_1388) * fVar208) * fStack_1374;
                  fVar193 = (fVar223 * (fStack_1434 + aStack_1444.field_0.x) -
                            fVar242 * ((float)auStack_1424[0] + fStack_1394)) * fStack_12bc +
                            (fVar242 * (fVar164 + local_1388._4_4_) -
                            (fStack_1434 + aStack_1444.field_0.x) * fVar203) *
                            (float)local_1488._4_4_ +
                            (((float)auStack_1424[0] + fStack_1394) * fVar203 -
                            (fVar164 + local_1388._4_4_) * fVar223) * fStack_1374;
                  fStack_13c0 = (fVar226 * (fStack_1430 + aStack_1444.field_0.y) -
                                fVar244 * (fStack_1420 + fStack_1390)) * fStack_12bc +
                                (fVar244 * (fVar222 + fStack_1380) -
                                (fStack_1430 + aStack_1444.field_0.y) * fVar204) * fStack_1480 +
                                ((fStack_1420 + fStack_1390) * fVar204 -
                                (fVar222 + fStack_1380) * fVar226) * fStack_1374;
                  fStack_13bc = (fVar228 * (fStack_142c + aStack_1444.field_0.z) -
                                fVar245 * (fStack_141c + fStack_138c)) * fStack_12bc +
                                (fVar245 * (fVar121 + fStack_137c) -
                                (fStack_142c + aStack_1444.field_0.z) * fVar206) * fStack_147c +
                                ((fStack_141c + fStack_138c) * fVar206 -
                                (fVar121 + fStack_137c) * fVar228) * fStack_1374;
                  local_1428[0] = (uint)fVar173;
                  auStack_1424[0] = (uint)fVar182;
                  fStack_1420 = fVar185;
                  fStack_141c = fVar191;
                  local_1438 = fVar211;
                  fStack_1434 = fVar162;
                  fStack_1430 = fVar163;
                  fStack_142c = fVar187;
                  auVar84._0_4_ =
                       ((float)local_1474._28_4_ * local_1108 - fVar173 * local_10e8) * fStack_12bc
                       + (fVar173 * local_10f8 - local_1108 * fVar211) * (float)local_1488._0_4_ +
                         (local_10e8 * fVar211 - local_10f8 * (float)local_1474._28_4_) *
                         fStack_1374;
                  auVar84._4_4_ =
                       (fStack_1454 * fStack_1104 - fVar182 * fStack_10e4) * fStack_12bc +
                       (fVar182 * fStack_10f4 - fStack_1104 * fVar162) * (float)local_1488._4_4_ +
                       (fStack_10e4 * fVar162 - fStack_10f4 * fStack_1454) * fStack_1374;
                  auVar84._8_4_ =
                       (fStack_1450 * fStack_1100 - fVar185 * fStack_10e0) * fStack_12bc +
                       (fVar185 * fStack_10f0 - fStack_1100 * fVar163) * fStack_1480 +
                       (fStack_10e0 * fVar163 - fStack_10f0 * fStack_1450) * fStack_1374;
                  auVar84._12_4_ =
                       (fStack_144c * fStack_10fc - fVar191 * fStack_10dc) * fStack_12bc +
                       (fVar191 * fStack_10ec - fStack_10fc * fVar187) * fStack_147c +
                       (fStack_10dc * fVar187 - fStack_10ec * fStack_144c) * fStack_1374;
                  local_1298._0_4_ = fVar230 + fVar192 + auVar84._0_4_;
                  local_1298._4_4_ = fVar232 + fVar193 + auVar84._4_4_;
                  local_1298._8_4_ = fStack_13b0 + fStack_13c0 + auVar84._8_4_;
                  local_1298._12_4_ = fStack_13ac + fStack_13bc + auVar84._12_4_;
                  uVar55 = CONCAT44(local_1298._4_4_,local_1298._0_4_);
                  local_1308 = (undefined1  [8])(uVar55 & 0x7fffffff7fffffff);
                  fStack_1300 = ABS(local_1298._8_4_);
                  fStack_12fc = ABS(local_1298._12_4_);
                  auVar131._4_4_ = fVar232;
                  auVar131._0_4_ = fVar230;
                  auVar131._8_4_ = fStack_13b0;
                  auVar131._12_4_ = fStack_13ac;
                  auVar39._4_4_ = fVar193;
                  auVar39._0_4_ = fVar192;
                  auVar39._8_4_ = fStack_13c0;
                  auVar39._12_4_ = fStack_13bc;
                  auVar218 = minps(auVar131,auVar39);
                  auVar124 = minps(auVar218,auVar84);
                  local_13b8 = (RayQueryContext *)CONCAT44(fVar232,fVar230);
                  auVar108._4_4_ = fVar232;
                  auVar108._0_4_ = fVar230;
                  auVar108._8_4_ = fStack_13b0;
                  auVar108._12_4_ = fStack_13ac;
                  local_13c8 = CONCAT44(fVar193,fVar192);
                  auVar40._4_4_ = fVar193;
                  auVar40._0_4_ = fVar192;
                  auVar40._8_4_ = fStack_13c0;
                  auVar40._12_4_ = fStack_13bc;
                  auVar218 = maxps(auVar108,auVar40);
                  auVar109 = maxps(auVar218,auVar84);
                  auVar218 = _local_1308;
                  auVar110._4_4_ = -(uint)(auVar109._4_4_ <= ABS(local_1298._4_4_) * 1.1920929e-07);
                  auVar110._0_4_ = -(uint)(auVar109._0_4_ <= ABS(local_1298._0_4_) * 1.1920929e-07);
                  auVar110._8_4_ = -(uint)(auVar109._8_4_ <= fStack_1300 * 1.1920929e-07);
                  auVar110._12_4_ = -(uint)(auVar109._12_4_ <= fStack_12fc * 1.1920929e-07);
                  auVar132._4_4_ =
                       -(uint)(-(ABS(local_1298._4_4_) * 1.1920929e-07) <= auVar124._4_4_);
                  auVar132._0_4_ =
                       -(uint)(-(ABS(local_1298._0_4_) * 1.1920929e-07) <= auVar124._0_4_);
                  auVar132._8_4_ = -(uint)(-(fStack_1300 * 1.1920929e-07) <= auVar124._8_4_);
                  auVar132._12_4_ = -(uint)(-(fStack_12fc * 1.1920929e-07) <= auVar124._12_4_);
                  auVar110 = auVar110 | auVar132;
                  auVar111._0_4_ = auVar110._0_4_ & local_1148;
                  auVar111._4_4_ = auVar110._4_4_ & uStack_1144;
                  auVar111._8_4_ = auVar110._8_4_ & uStack_1140;
                  auVar111._12_4_ = auVar110._12_4_ & uStack_113c;
                  iVar45 = movmskps(uVar119,auVar111);
                  uVar55 = local_11c8;
                  uVar57 = local_1474._12_8_;
                  uVar60 = local_11b8;
                  uVar61 = local_11c0;
                  uVar62 = local_11d0;
                  uVar64 = local_11d8;
                  pRVar65 = pRVar59;
                  ray = pRVar44;
                  fVar189 = local_1158;
                  fVar121 = fStack_1154;
                  fVar122 = fStack_1150;
                  fVar188 = fStack_114c;
                  auVar109 = local_1048;
                  fVar174 = local_10b8;
                  fVar183 = fStack_10b4;
                  fVar186 = fStack_10b0;
                  fVar233 = fStack_10ac;
                  fVar190 = local_1168;
                  fVar201 = fStack_1164;
                  fVar205 = fStack_1160;
                  fVar229 = fStack_115c;
                  fVar172 = local_1178;
                  fVar181 = fStack_1174;
                  fVar184 = fStack_1170;
                  fVar231 = fStack_116c;
                  fVar217 = local_1208;
                  fVar209 = fStack_1204;
                  fVar164 = fStack_1200;
                  fVar222 = fStack_11fc;
                  fVar234 = local_10a8;
                  fVar235 = fStack_10a4;
                  fVar236 = fStack_10a0;
                  fVar224 = fStack_109c;
                  fVar237 = local_10c8;
                  fVar241 = fStack_10c4;
                  fVar243 = fStack_10c0;
                  fVar98 = fStack_10bc;
                  _local_1308 = auVar218;
                  if (iVar45 != 0) {
                    local_1498._4_4_ = fVar210 * fVar242 - fStack_13a4 * fVar223;
                    local_1498._0_4_ = fVar207 * fVar238 - local_13a8 * fVar208;
                    fStack_1490 = fVar225 * fVar244 - fStack_13a0 * fVar226;
                    fStack_148c = fVar227 * fVar245 - fStack_139c * fVar228;
                    auVar221._0_4_ = fVar208 * fVar173 - fVar238 * (float)local_1474._28_4_;
                    auVar221._4_4_ = fVar223 * fVar182 - fVar242 * fStack_1454;
                    auVar221._8_4_ = fVar226 * fVar185 - fVar244 * fStack_1450;
                    auVar221._12_4_ = fVar228 * fVar191 - fVar245 * fStack_144c;
                    uVar53 = (uint)DAT_01f7b6c0;
                    uVar118 = DAT_01f7b6c0._4_4_;
                    uVar119 = DAT_01f7b6c0._8_4_;
                    uVar120 = DAT_01f7b6c0._12_4_;
                    auVar85._4_4_ =
                         -(uint)((float)((uint)(fStack_13a4 * fVar223) & uVar118) <
                                (float)((uint)(fVar242 * fStack_1454) & uVar118));
                    auVar85._0_4_ =
                         -(uint)((float)((uint)(local_13a8 * fVar208) & uVar53) <
                                (float)((uint)(fVar238 * (float)local_1474._28_4_) & uVar53));
                    auVar85._8_4_ =
                         -(uint)((float)((uint)(fStack_13a0 * fVar226) & uVar119) <
                                (float)((uint)(fVar244 * fStack_1450) & uVar119));
                    auVar85._12_4_ =
                         -(uint)((float)((uint)(fStack_139c * fVar228) & uVar120) <
                                (float)((uint)(fVar245 * fStack_144c) & uVar120));
                    local_1238 = blendvps(auVar221,_local_1498,auVar85);
                    auVar240._0_4_ = fVar238 * fVar211 - fVar202 * fVar173;
                    auVar240._4_4_ = fVar242 * fVar162 - fVar203 * fVar182;
                    auVar240._8_4_ = fVar244 * fVar163 - fVar204 * fVar185;
                    auVar240._12_4_ = fVar245 * fVar187 - fVar206 * fVar191;
                    auVar86._4_4_ =
                         -(uint)((float)((uint)(fStack_12d4 * fVar242) & uVar118) <
                                (float)((uint)(fVar203 * fVar182) & uVar118));
                    auVar86._0_4_ =
                         -(uint)((float)((uint)(local_12d8 * fVar238) & uVar53) <
                                (float)((uint)(fVar202 * fVar173) & uVar53));
                    auVar86._8_4_ =
                         -(uint)((float)((uint)(fStack_12d0 * fVar244) & uVar119) <
                                (float)((uint)(fVar204 * fVar185) & uVar119));
                    auVar86._12_4_ =
                         -(uint)((float)((uint)(fStack_12cc * fVar245) & uVar120) <
                                (float)((uint)(fVar206 * fVar191) & uVar120));
                    auVar41._4_4_ = fStack_13a4 * fVar203 - fStack_12d4 * fVar242;
                    auVar41._0_4_ = local_13a8 * fVar202 - local_12d8 * fVar238;
                    auVar41._8_4_ = fStack_13a0 * fVar204 - fStack_12d0 * fVar244;
                    auVar41._12_4_ = fStack_139c * fVar206 - fStack_12cc * fVar245;
                    local_1228 = blendvps(auVar240,auVar41,auVar86);
                    auVar214._0_4_ = local_12d8 * fVar208 - fVar207 * fVar202;
                    auVar214._4_4_ = fStack_12d4 * fVar223 - fVar210 * fVar203;
                    auVar214._8_4_ = fStack_12d0 * fVar226 - fVar225 * fVar204;
                    auVar214._12_4_ = fStack_12cc * fVar228 - fVar227 * fVar206;
                    auVar212._0_4_ = fVar202 * (float)local_1474._28_4_ - fVar208 * fVar211;
                    auVar212._4_4_ = fVar203 * fStack_1454 - fVar223 * fVar162;
                    auVar212._8_4_ = fVar204 * fStack_1450 - fVar226 * fVar163;
                    auVar212._12_4_ = fVar206 * fStack_144c - fVar228 * fVar187;
                    auVar87._4_4_ =
                         -(uint)((float)((uint)(fVar210 * fVar203) & uVar118) <
                                (float)((uint)(fVar223 * fVar162) & uVar118));
                    auVar87._0_4_ =
                         -(uint)((float)((uint)(fVar207 * fVar202) & uVar53) <
                                (float)((uint)(fVar208 * fVar211) & uVar53));
                    auVar87._8_4_ =
                         -(uint)((float)((uint)(fVar225 * fVar204) & uVar119) <
                                (float)((uint)(fVar226 * fVar163) & uVar119));
                    auVar87._12_4_ =
                         -(uint)((float)((uint)(fVar227 * fVar206) & uVar120) <
                                (float)((uint)(fVar228 * fVar187) & uVar120));
                    local_1218 = blendvps(auVar212,auVar214,auVar87);
                    fVar211 = fStack_12bc * local_1238._0_4_ +
                              (float)local_1488._0_4_ * local_1228._0_4_ +
                              fStack_1374 * local_1218._0_4_;
                    fVar162 = fStack_12bc * local_1238._4_4_ +
                              (float)local_1488._4_4_ * local_1228._4_4_ +
                              fStack_1374 * local_1218._4_4_;
                    fVar163 = fStack_12bc * local_1238._8_4_ +
                              fStack_1480 * local_1228._8_4_ + fStack_1374 * local_1218._8_4_;
                    fVar187 = fStack_12bc * local_1238._12_4_ +
                              fStack_147c * local_1228._12_4_ + fStack_1374 * local_1218._12_4_;
                    auVar197._0_4_ = fVar211 + fVar211;
                    auVar197._4_4_ = fVar162 + fVar162;
                    auVar197._8_4_ = fVar163 + fVar163;
                    auVar197._12_4_ = fVar187 + fVar187;
                    auVar88._0_4_ = local_1398 * local_1228._0_4_ + fVar97 * local_1218._0_4_;
                    auVar88._4_4_ =
                         fStack_1394 * local_1228._4_4_ + aStack_1444.field_0.x * local_1218._4_4_;
                    auVar88._8_4_ =
                         fStack_1390 * local_1228._8_4_ + aStack_1444.field_0.y * local_1218._8_4_;
                    auVar88._12_4_ =
                         fStack_138c * local_1228._12_4_ + aStack_1444.field_0.z * local_1218._12_4_
                    ;
                    fVar173 = (float)local_1388 * local_1238._0_4_ + auVar88._0_4_;
                    fVar182 = local_1388._4_4_ * local_1238._4_4_ + auVar88._4_4_;
                    fVar185 = fStack_1380 * local_1238._8_4_ + auVar88._8_4_;
                    fVar191 = fStack_137c * local_1238._12_4_ + auVar88._12_4_;
                    auVar218 = rcpps(auVar88,auVar197);
                    fVar211 = auVar218._0_4_;
                    fVar162 = auVar218._4_4_;
                    fVar163 = auVar218._8_4_;
                    fVar187 = auVar218._12_4_;
                    auVar133._0_4_ =
                         ((1.0 - auVar197._0_4_ * fVar211) * fVar211 + fVar211) *
                         (fVar173 + fVar173);
                    auVar133._4_4_ =
                         ((1.0 - auVar197._4_4_ * fVar162) * fVar162 + fVar162) *
                         (fVar182 + fVar182);
                    auVar133._8_4_ =
                         ((1.0 - auVar197._8_4_ * fVar163) * fVar163 + fVar163) *
                         (fVar185 + fVar185);
                    auVar133._12_4_ =
                         ((1.0 - auVar197._12_4_ * fVar187) * fVar187 + fVar187) *
                         (fVar191 + fVar191);
                    local_1488._0_4_ = (pRVar44->super_RayK<1>).tfar;
                    local_1488._4_4_ = (pRVar44->super_RayK<1>).mask;
                    fStack_1480 = (float)(pRVar44->super_RayK<1>).id;
                    fStack_147c = (float)(pRVar44->super_RayK<1>).flags;
                    fVar211 = (pRVar44->super_RayK<1>).org.field_0.m128[3];
                    auVar198._0_4_ =
                         (int)((uint)(auVar197._0_4_ != 0.0 &&
                                     (auVar133._0_4_ <= (float)local_1488._0_4_ &&
                                     fVar211 <= auVar133._0_4_)) * -0x80000000) >> 0x1f;
                    auVar198._4_4_ =
                         (int)((uint)(auVar197._4_4_ != 0.0 &&
                                     (auVar133._4_4_ <= (float)local_1488._0_4_ &&
                                     fVar211 <= auVar133._4_4_)) * -0x80000000) >> 0x1f;
                    auVar198._8_4_ =
                         (int)((uint)(auVar197._8_4_ != 0.0 &&
                                     (auVar133._8_4_ <= (float)local_1488._0_4_ &&
                                     fVar211 <= auVar133._8_4_)) * -0x80000000) >> 0x1f;
                    auVar198._12_4_ =
                         (int)((uint)(auVar197._12_4_ != 0.0 &&
                                     (auVar133._12_4_ <= (float)local_1488._0_4_ &&
                                     fVar211 <= auVar133._12_4_)) * -0x80000000) >> 0x1f;
                    auVar199 = auVar198 & auVar111;
                    iVar45 = movmskps(iVar45,auVar199);
                    if (iVar45 != 0) {
                      uVar48 = extractps(_local_1488,1);
                      local_1288 = &local_14a1;
                      local_1278 = auVar199;
                      local_1248 = auVar133;
                      auVar144._0_4_ = local_1298._0_4_ - fVar192;
                      auVar144._4_4_ = local_1298._4_4_ - fVar193;
                      auVar144._8_4_ = local_1298._8_4_ - fStack_13c0;
                      auVar144._12_4_ = local_1298._12_4_ - fStack_13bc;
                      auVar112._4_12_ = auVar111._4_12_;
                      auVar112._0_4_ = (float)(int)(*(ushort *)((long)&context->user + lVar58) - 1);
                      auVar200._4_4_ = auVar111._4_4_;
                      auVar200._0_4_ = auVar112._0_4_;
                      auVar200._8_4_ = auVar111._8_4_;
                      auVar200._12_4_ = auVar111._12_4_;
                      auVar218 = rcpss(auVar200,auVar112);
                      fVar211 = (float)(int)(*(ushort *)((long)&context->user + lVar58 + 2) - 1);
                      fStack_12ac = (2.0 - auVar112._0_4_ * auVar218._0_4_) * auVar218._0_4_;
                      auVar218 = rcpss(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211));
                      fStack_129c = (2.0 - fVar211 * auVar218._0_4_) * auVar218._0_4_;
                      local_12b8._0_4_ =
                           fStack_12ac *
                           ((float)(int)local_12e8._0_4_ * local_1298._0_4_ +
                           (local_1298._0_4_ - fVar230));
                      local_12b8._4_4_ =
                           fStack_12ac *
                           ((float)(local_12e8._0_4_ + 1) * local_1298._4_4_ +
                           (local_1298._4_4_ - fVar232));
                      fStack_12b0 = fStack_12ac *
                                    ((float)(local_12e8._0_4_ + 1) * local_1298._8_4_ +
                                    (local_1298._8_4_ - fStack_13b0));
                      fStack_12ac = fStack_12ac *
                                    ((float)(int)local_12e8._0_4_ * local_1298._12_4_ +
                                    (local_1298._12_4_ - fStack_13ac));
                      local_12a8 = fStack_129c *
                                   ((float)(int)local_12f8._0_4_ * local_1298._0_4_ + auVar144._0_4_
                                   );
                      fStack_12a4 = fStack_129c *
                                    ((float)(int)local_12f8._0_4_ * local_1298._4_4_ +
                                    auVar144._4_4_);
                      fStack_12a0 = fStack_129c *
                                    ((float)(local_12f8._0_4_ + 1) * local_1298._8_4_ +
                                    auVar144._8_4_);
                      fStack_129c = fStack_129c *
                                    ((float)(local_12f8._0_4_ + 1) * local_1298._12_4_ +
                                    auVar144._12_4_);
                      pGVar21 = (pRVar59->scene->geometries).items[local_1474._4_8_].ptr;
                      context = (RayQueryContext *)local_1474._4_8_;
                      if ((pGVar21->mask & (uint)uVar48) != 0) {
                        local_1418 = auVar199;
                        auVar218 = rcpps(auVar144,local_1298);
                        fVar211 = auVar218._0_4_;
                        fVar162 = auVar218._4_4_;
                        fVar163 = auVar218._8_4_;
                        fVar187 = auVar218._12_4_;
                        local_1308._4_4_ = (undefined4)((ulong)local_1308 >> 0x20);
                        fVar211 = (float)(-(uint)(1e-18 <= (float)local_1308._0_4_) &
                                         (uint)(((float)DAT_01f7ba10 - local_1298._0_4_ * fVar211) *
                                                fVar211 + fVar211));
                        fVar162 = (float)(-(uint)(1e-18 <= (float)local_1308._4_4_) &
                                         (uint)((DAT_01f7ba10._4_4_ - local_1298._4_4_ * fVar162) *
                                                fVar162 + fVar162));
                        fVar163 = (float)(-(uint)(1e-18 <= fStack_1300) &
                                         (uint)((DAT_01f7ba10._8_4_ - local_1298._8_4_ * fVar163) *
                                                fVar163 + fVar163));
                        fVar187 = (float)(-(uint)(1e-18 <= fStack_12fc) &
                                         (uint)((DAT_01f7ba10._12_4_ - local_1298._12_4_ * fVar187)
                                                * fVar187 + fVar187));
                        auVar215._0_4_ = (float)local_12b8._0_4_ * fVar211;
                        auVar215._4_4_ = (float)local_12b8._4_4_ * fVar162;
                        auVar215._8_4_ = fStack_12b0 * fVar163;
                        auVar215._12_4_ = fStack_12ac * fVar187;
                        local_1268 = minps(auVar215,_DAT_01f7ba10);
                        auVar113._0_4_ = local_12a8 * fVar211;
                        auVar113._4_4_ = fStack_12a4 * fVar162;
                        auVar113._8_4_ = fStack_12a0 * fVar163;
                        auVar113._12_4_ = fStack_129c * fVar187;
                        local_1258 = minps(auVar113,_DAT_01f7ba10);
                        auVar218 = blendvps(_DAT_01f7a9f0,auVar133,auVar199);
                        auVar134._4_4_ = auVar218._0_4_;
                        auVar134._0_4_ = auVar218._4_4_;
                        auVar134._8_4_ = auVar218._12_4_;
                        auVar134._12_4_ = auVar218._8_4_;
                        auVar124 = minps(auVar134,auVar218);
                        auVar145._0_8_ = auVar124._8_8_;
                        auVar145._8_4_ = auVar124._0_4_;
                        auVar145._12_4_ = auVar124._4_4_;
                        auVar124 = minps(auVar145,auVar124);
                        auVar146._0_8_ =
                             CONCAT44(-(uint)(auVar124._4_4_ == auVar218._4_4_) & auVar199._4_4_,
                                      -(uint)(auVar124._0_4_ == auVar218._0_4_) & auVar199._0_4_);
                        auVar146._8_4_ = -(uint)(auVar124._8_4_ == auVar218._8_4_) & auVar199._8_4_;
                        auVar146._12_4_ =
                             -(uint)(auVar124._12_4_ == auVar218._12_4_) & auVar199._12_4_;
                        iVar45 = movmskps((uint)uVar48,auVar146);
                        if (iVar45 != 0) {
                          auVar199._8_4_ = auVar146._8_4_;
                          auVar199._0_8_ = auVar146._0_8_;
                          auVar199._12_4_ = auVar146._12_4_;
                        }
                        uVar46 = movmskps(iVar45,auVar199);
                        uVar49 = CONCAT44((int)((ulong)uVar48 >> 0x20),uVar46);
                        lVar58 = 0;
                        if (uVar49 != 0) {
                          for (; (uVar49 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                          }
                        }
                        pRVar26 = pRVar59->args;
                        auVar218 = auVar133;
                        fStack_1370 = fStack_1374;
                        fStack_136c = fStack_1374;
                        local_12c8 = fStack_12bc;
                        fStack_12c4 = fStack_12bc;
                        fStack_12c0 = fStack_12bc;
                        local_1378 = fStack_1374;
                        if (pRVar26->filter == (RTCFilterFunctionN)0x0) {
                          pRVar56 = pRVar59->user;
                          if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                            fVar211 = *(float *)(local_1268 + lVar58 * 4);
                            fVar97 = *(float *)(local_1258 + lVar58 * 4);
                            fVar162 = *(float *)(local_1238 + lVar58 * 4);
                            fVar163 = *(float *)(local_1228 + lVar58 * 4);
                            fVar187 = *(float *)(local_1218 + lVar58 * 4);
                            (pRVar44->super_RayK<1>).tfar = *(float *)(local_1248 + lVar58 * 4);
                            (pRVar44->Ng).field_0.field_0.x = fVar162;
                            (pRVar44->Ng).field_0.field_0.y = fVar163;
                            (pRVar44->Ng).field_0.field_0.z = fVar187;
                            pRVar44->u = fVar211;
                            pRVar44->v = fVar97;
                            pRVar44->primID = (uint)local_1474._20_8_;
                            pRVar44->geomID = (uint)local_1474._4_8_;
                            pRVar44->instID[0] = pRVar56->instID[0];
                            pRVar44->instPrimID[0] = pRVar56->instPrimID[0];
                            goto LAB_00db1c18;
                          }
                        }
                        else {
                          pRVar56 = pRVar59->user;
                        }
LAB_00db1fe6:
                        _local_1498 = auVar218;
                        local_135c = *(undefined4 *)(local_1268 + lVar58 * 4);
                        local_1358 = *(undefined4 *)(local_1258 + lVar58 * 4);
                        (pRVar44->super_RayK<1>).tfar = *(float *)(local_1248 + lVar58 * 4);
                        local_1368 = *(float *)(local_1238 + lVar58 * 4);
                        local_1364 = *(undefined4 *)(local_1228 + lVar58 * 4);
                        local_1360 = *(undefined4 *)(local_1218 + lVar58 * 4);
                        local_1354 = (int)local_1474._20_8_;
                        local_1350 = (int)local_1474._4_8_;
                        local_134c = pRVar56->instID[0];
                        local_1348 = pRVar56->instPrimID[0];
                        local_1474._0_4_ = -NAN;
                        local_13f8.valid = (int *)local_1474;
                        local_13f8.geometryUserPtr = pGVar21->userPtr;
                        local_13f8.context = pRVar56;
                        local_13f8.ray = (RTCRayN *)pRVar44;
                        local_13f8.hit = (RTCHitN *)&local_1368;
                        local_13f8.N = 1;
                        local_1448 = fVar97;
                        if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00db20fa:
                          if ((pRVar26->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar26->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar26->filter)(&local_13f8);
                            context = extraout_RDX_00;
                            uVar51 = local_14a0;
                            auVar133 = _local_1498;
                            fVar97 = local_1448;
                            if ((((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00db218c;
                          }
                          (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_13f8.hit;
                          (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_13f8.hit + 4);
                          (((Vec3f *)((long)local_13f8.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_13f8.hit + 8);
                          *(float *)((long)local_13f8.ray + 0x3c) = *(float *)(local_13f8.hit + 0xc)
                          ;
                          *(float *)((long)local_13f8.ray + 0x40) =
                               *(float *)(local_13f8.hit + 0x10);
                          *(float *)((long)local_13f8.ray + 0x44) =
                               *(float *)(local_13f8.hit + 0x14);
                          *(float *)((long)local_13f8.ray + 0x48) =
                               *(float *)(local_13f8.hit + 0x18);
                          context = (RayQueryContext *)
                                    (ulong)(uint)*(float *)(local_13f8.hit + 0x1c);
                          *(float *)((long)local_13f8.ray + 0x4c) =
                               *(float *)(local_13f8.hit + 0x1c);
                          *(float *)((long)local_13f8.ray + 0x50) =
                               *(float *)(local_13f8.hit + 0x20);
                          pRVar50 = (RayHit *)local_13f8.ray;
                          fVar97 = local_1448;
                        }
                        else {
                          (*pGVar21->intersectionFilterN)(&local_13f8);
                          context = extraout_RDX;
                          uVar51 = local_14a0;
                          auVar133 = _local_1498;
                          fVar97 = local_1448;
                          if ((((RayK<1> *)local_13f8.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00db20fa;
LAB_00db218c:
                          (pRVar44->super_RayK<1>).tfar = (float)local_1488._0_4_;
                          pRVar50 = (RayHit *)local_13f8.valid;
                          uVar51 = local_14a0;
                          auVar133 = _local_1498;
                        }
                        *(undefined4 *)(local_1418 + lVar58 * 4) = 0;
                        local_1488._0_4_ = (pRVar44->super_RayK<1>).tfar;
                        local_1488._4_4_ = (pRVar44->super_RayK<1>).mask;
                        fStack_1480 = (float)(pRVar44->super_RayK<1>).id;
                        fStack_147c = (float)(pRVar44->super_RayK<1>).flags;
                        auVar90._0_4_ =
                             -(uint)(auVar133._0_4_ <= (float)local_1488._0_4_) & local_1418._0_4_;
                        auVar90._4_4_ =
                             -(uint)(auVar133._4_4_ <= (float)local_1488._0_4_) & local_1418._4_4_;
                        auVar90._8_4_ =
                             -(uint)(auVar133._8_4_ <= (float)local_1488._0_4_) & local_1418._8_4_;
                        auVar90._12_4_ =
                             -(uint)(auVar133._12_4_ <= (float)local_1488._0_4_) & local_1418._12_4_
                        ;
                        local_1418 = auVar90;
                        iVar45 = movmskps((int)pRVar50,auVar90);
                        uVar55 = local_11c8;
                        uVar57 = local_1474._12_8_;
                        uVar60 = local_11b8;
                        uVar61 = local_11c0;
                        uVar62 = local_11d0;
                        uVar64 = local_11d8;
                        fVar189 = local_1158;
                        fVar121 = fStack_1154;
                        fVar122 = fStack_1150;
                        fVar188 = fStack_114c;
                        auVar109 = local_1048;
                        fVar174 = local_10b8;
                        fVar183 = fStack_10b4;
                        fVar186 = fStack_10b0;
                        fVar233 = fStack_10ac;
                        fVar190 = local_1168;
                        fVar201 = fStack_1164;
                        fVar205 = fStack_1160;
                        fVar229 = fStack_115c;
                        fVar172 = local_1178;
                        fVar181 = fStack_1174;
                        fVar184 = fStack_1170;
                        fVar231 = fStack_116c;
                        fVar217 = local_1208;
                        fVar209 = fStack_1204;
                        fVar164 = fStack_1200;
                        fVar222 = fStack_11fc;
                        fVar234 = local_10a8;
                        fVar235 = fStack_10a4;
                        fVar236 = fStack_10a0;
                        fVar224 = fStack_109c;
                        fVar237 = local_10c8;
                        fVar241 = fStack_10c4;
                        fVar243 = fStack_10c0;
                        fVar98 = fStack_10bc;
                        if (iVar45 != 0) {
                          auVar109 = blendvps(_DAT_01f7a9f0,auVar133,auVar90);
                          auVar148._4_4_ = auVar109._0_4_;
                          auVar148._0_4_ = auVar109._4_4_;
                          auVar148._8_4_ = auVar109._12_4_;
                          auVar148._12_4_ = auVar109._8_4_;
                          auVar218 = minps(auVar148,auVar109);
                          auVar116._0_8_ = auVar218._8_8_;
                          auVar116._8_4_ = auVar218._0_4_;
                          auVar116._12_4_ = auVar218._4_4_;
                          auVar218 = minps(auVar116,auVar218);
                          auVar117._0_8_ =
                               CONCAT44(-(uint)(auVar218._4_4_ == auVar109._4_4_) & auVar90._4_4_,
                                        -(uint)(auVar218._0_4_ == auVar109._0_4_) & auVar90._0_4_);
                          auVar117._8_4_ = -(uint)(auVar218._8_4_ == auVar109._8_4_) & auVar90._8_4_
                          ;
                          auVar117._12_4_ =
                               -(uint)(auVar218._12_4_ == auVar109._12_4_) & auVar90._12_4_;
                          iVar45 = movmskps(iVar45,auVar117);
                          if (iVar45 != 0) {
                            auVar90._8_4_ = auVar117._8_4_;
                            auVar90._0_8_ = auVar117._0_8_;
                            auVar90._12_4_ = auVar117._12_4_;
                          }
                          uVar46 = movmskps(iVar45,auVar90);
                          uVar55 = CONCAT44((int)((ulong)pRVar50 >> 0x20),uVar46);
                          lVar58 = 0;
                          auVar218 = _local_1498;
                          if (uVar55 != 0) {
                            for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                            }
                          }
                          goto LAB_00db1fe6;
                        }
                      }
                    }
                  }
                }
LAB_00db1c18:
                local_11a0 = local_11a0 & local_11a0 - 1;
              } while (local_11a0 != 0);
            }
            local_11e0 = local_11e0 + 1;
          } while (local_11e0 != local_11e8);
        }
        fVar97 = (ray->super_RayK<1>).tfar;
        auVar109._4_4_ = fVar97;
        auVar109._0_4_ = fVar97;
        auVar109._8_4_ = fVar97;
        auVar109._12_4_ = fVar97;
        auVar218 = local_1198;
        fVar162 = local_1188;
        fVar163 = fStack_1184;
        fVar187 = fStack_1180;
        fVar211 = fStack_117c;
      }
    } while (local_11f0 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }